

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

void ncnn::transpose_unpack_output_tile(Mat *topT,Mat *top_blob,int i,int max_ii,int j,int max_jj)

{
  long lVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  size_t *psVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined8 *puVar22;
  undefined8 *puVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  undefined4 *puVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  undefined1 (*pauVar37) [64];
  ulong uVar38;
  undefined1 (*pauVar39) [32];
  undefined1 (*pauVar40) [16];
  undefined4 *puVar41;
  long lVar42;
  undefined1 (*pauVar43) [64];
  undefined1 (*pauVar44) [32];
  undefined1 (*pauVar45) [16];
  int iVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  uint uVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  undefined1 (*pauVar54) [64];
  long lVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  __m128 tmp1;
  __m128 tmp1_1;
  undefined1 auVar107 [32];
  __m128 tmp2;
  __m128 tmp3;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  long local_108;
  long local_f8;
  int local_e8;
  long local_e0;
  long local_d8;
  long local_c8;
  long local_c0;
  long local_b0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  
  iVar2 = top_blob->elempack;
  psVar17 = (size_t *)&top_blob->w;
  if (top_blob->dims == 3) {
    psVar17 = &top_blob->cstep;
  }
  iVar47 = (int)*psVar17;
  lVar31 = (long)iVar47;
  pauVar54 = (undefined1 (*) [64])topT->data;
  uVar28 = j % 0x10;
  lVar18 = (long)((j / 0x10) * iVar47 * 0x10);
  lVar55 = (long)(iVar47 * 0x10);
  lVar19 = (long)((j / 8) * iVar47 * 8);
  lVar36 = (long)(iVar47 * 8);
  uVar50 = j & 0x80000007;
  lVar20 = (long)(iVar47 * j);
  iVar29 = 0;
  if (0 < max_jj) {
    iVar29 = max_jj;
  }
  lVar30 = (long)i;
  lVar25 = (long)max_ii;
  lVar26 = lVar30 * 0x10;
  lVar51 = lVar26 + lVar20 * 4;
  lVar42 = lVar26 + lVar20 * 4 + 0x1c;
  lVar34 = lVar26 + 0x30 + lVar20 * 4;
  local_b0 = lVar26 + 0x60 + lVar20 * 4;
  local_108 = lVar26 + 0xc0 + lVar20 * 4;
  lVar26 = lVar20 * 4 + lVar30 * 4;
  lVar48 = lVar20 * 4 + lVar30 * 4 + 4;
  lVar53 = (long)(iVar47 * 4) * 4;
  lVar32 = lVar31 * 4;
  lVar20 = lVar55 * 4;
  lVar1 = lVar36 * 4;
  for (uVar38 = 0; (long)(uVar38 | 0xf) < lVar25; uVar38 = uVar38 + 0x10) {
    if (iVar2 == 0x10) {
      pauVar37 = (undefined1 (*) [64])((long)top_blob->data + (uVar38 + lVar30) * 0x40 + lVar18 * 4)
      ;
      if (uVar28 == 0xc) {
        auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
        auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
        auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
        auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
        auVar87 = vunpcklpd_avx512f(auVar83,auVar85);
        auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
        auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
        auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
        *(undefined1 (*) [16])(*pauVar37 + 0x30) = auVar87._0_16_;
        *(undefined1 (*) [16])(pauVar37[1] + 0x30) = auVar83._0_16_;
        *(undefined1 (*) [16])(pauVar37[2] + 0x30) = auVar85._0_16_;
        *(undefined1 (*) [16])(pauVar37[3] + 0x30) = auVar84._0_16_;
        auVar57 = vextractf32x4_avx512f(auVar87,1);
        *(undefined1 (*) [16])(pauVar37[2] + 0x18) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,1);
        *(undefined1 (*) [16])(pauVar37[2] + 0x38) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,1);
        *(undefined1 (*) [16])(pauVar37[3] + 0x18) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,1);
        *(undefined1 (*) [16])(pauVar37[3] + 0x38) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar87,2);
        *(undefined1 (*) [16])(pauVar37[4] + 0x18) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,2);
        *(undefined1 (*) [16])(pauVar37[4] + 0x38) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,2);
        *(undefined1 (*) [16])(pauVar37[5] + 0x18) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,2);
        *(undefined1 (*) [16])(pauVar37[5] + 0x38) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar87,3);
        *(undefined1 (*) [16])(pauVar37[6] + 0x18) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,3);
        *(undefined1 (*) [16])(pauVar37[6] + 0x38) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,3);
        *(undefined1 (*) [16])(pauVar37[7] + 0x18) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,3);
        *(undefined1 (*) [16])(pauVar37[7] + 0x38) = auVar57;
        pauVar54 = pauVar54 + 4;
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar55 * 4);
        iVar46 = 4;
      }
      else {
        if (uVar28 == 8) {
          auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
          auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
          auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
          auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
          if (max_jj < 5) {
            auVar87 = vunpcklpd_avx512f(auVar83,auVar85);
            auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
            auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
            auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
            *(undefined1 (*) [16])(*pauVar37 + 0x20) = auVar87._0_16_;
            *(undefined1 (*) [16])(pauVar37[1] + 0x20) = auVar83._0_16_;
            *(undefined1 (*) [16])(pauVar37[2] + 0x20) = auVar85._0_16_;
            *(undefined1 (*) [16])(pauVar37[3] + 0x20) = auVar84._0_16_;
            auVar57 = vextractf32x4_avx512f(auVar87,1);
            *(undefined1 (*) [16])(pauVar37[2] + 0x10) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar83,1);
            *(undefined1 (*) [16])(pauVar37[2] + 0x30) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar85,1);
            *(undefined1 (*) [16])(pauVar37[3] + 0x10) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar84,1);
            *(undefined1 (*) [16])(pauVar37[3] + 0x30) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar87,2);
            *(undefined1 (*) [16])(pauVar37[4] + 0x10) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar83,2);
            *(undefined1 (*) [16])(pauVar37[4] + 0x30) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar85,2);
            *(undefined1 (*) [16])(pauVar37[5] + 0x10) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar84,2);
            *(undefined1 (*) [16])(pauVar37[5] + 0x30) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar87,3);
            *(undefined1 (*) [16])(pauVar37[6] + 0x10) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar83,3);
            *(undefined1 (*) [16])(pauVar37[6] + 0x30) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar85,3);
            *(undefined1 (*) [16])(pauVar37[7] + 0x10) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar84,3);
            *(undefined1 (*) [16])(pauVar37[7] + 0x30) = auVar57;
            lVar21 = 0x100;
            iVar46 = 4;
          }
          else {
            auVar87 = vunpcklps_avx512f(pauVar54[4],pauVar54[5]);
            auVar88 = vunpckhps_avx512f(pauVar54[4],pauVar54[5]);
            auVar89 = vunpcklps_avx512f(pauVar54[6],pauVar54[7]);
            auVar90 = vunpckhps_avx512f(pauVar54[6],pauVar54[7]);
            auVar91 = vunpcklpd_avx512f(auVar83,auVar85);
            auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
            auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
            auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
            auVar86 = vunpcklpd_avx512f(auVar87,auVar89);
            auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
            auVar89 = vunpcklpd_avx512f(auVar88,auVar90);
            auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
            auVar90 = vshuff64x2_avx512f(auVar91,auVar86,0x88);
            auVar92 = vshuff64x2_avx512f(auVar83,auVar87,0x88);
            auVar93 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
            auVar94 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
            auVar86 = vshuff64x2_avx512f(auVar91,auVar86,0xdd);
            auVar83 = vshuff64x2_avx512f(auVar83,auVar87,0xdd);
            auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
            auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
            auVar87 = vshuff64x2_avx512f(auVar90,auVar92,0x88);
            auVar88 = vshuff64x2_avx512f(auVar93,auVar94,0x88);
            auVar89 = vshuff64x2_avx512f(auVar86,auVar83,0x88);
            auVar91 = vshuff64x2_avx512f(auVar85,auVar84,0x88);
            auVar90 = vshuff64x2_avx512f(auVar90,auVar92,0xdd);
            auVar92 = vshuff64x2_avx512f(auVar93,auVar94,0xdd);
            auVar83 = vshuff64x2_avx512f(auVar86,auVar83,0xdd);
            auVar84 = vshuff64x2_avx512f(auVar85,auVar84,0xdd);
            *(undefined1 (*) [32])(*pauVar37 + 0x20) = auVar87._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar87,1);
            *(undefined1 (*) [32])(pauVar37[1] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[2] + 0x20) = auVar88._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar88,1);
            *(undefined1 (*) [32])(pauVar37[3] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[4] + 0x20) = auVar89._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar89,1);
            *(undefined1 (*) [32])(pauVar37[5] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[6] + 0x20) = auVar91._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar91,1);
            *(undefined1 (*) [32])(pauVar37[7] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[8] + 0x20) = auVar90._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar90,1);
            *(undefined1 (*) [32])(pauVar37[9] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[10] + 0x20) = auVar92._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar92,1);
            *(undefined1 (*) [32])(pauVar37[0xb] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[0xc] + 0x20) = auVar83._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar83,1);
            *(undefined1 (*) [32])(pauVar37[0xd] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[0xe] + 0x20) = auVar84._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar84,1);
            *(undefined1 (*) [32])(pauVar37[0xf] + 0x20) = auVar71;
            lVar21 = 0x200;
            iVar46 = 8;
          }
        }
        else {
          iVar46 = 0;
          if (uVar28 != 4) goto LAB_0044f50f;
          auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
          auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
          auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
          auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
          if (max_jj < 5) {
            auVar87 = vunpcklpd_avx512f(auVar83,auVar85);
            auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
            auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
            auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
            *(undefined1 (*) [16])(*pauVar37 + 0x10) = auVar87._0_16_;
            *(undefined1 (*) [16])(pauVar37[1] + 0x10) = auVar83._0_16_;
            *(undefined1 (*) [16])(pauVar37[2] + 0x10) = auVar85._0_16_;
            *(undefined1 (*) [16])(pauVar37[3] + 0x10) = auVar84._0_16_;
            auVar57 = vextractf32x4_avx512f(auVar87,1);
            *(undefined1 (*) [16])(pauVar37[2] + 8) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar83,1);
            *(undefined1 (*) [16])(pauVar37[2] + 0x28) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar85,1);
            *(undefined1 (*) [16])(pauVar37[3] + 8) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar84,1);
            *(undefined1 (*) [16])(pauVar37[3] + 0x28) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar87,2);
            *(undefined1 (*) [16])(pauVar37[4] + 8) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar83,2);
            *(undefined1 (*) [16])(pauVar37[4] + 0x28) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar85,2);
            *(undefined1 (*) [16])(pauVar37[5] + 8) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar84,2);
            *(undefined1 (*) [16])(pauVar37[5] + 0x28) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar87,3);
            *(undefined1 (*) [16])(pauVar37[6] + 8) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar83,3);
            *(undefined1 (*) [16])(pauVar37[6] + 0x28) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar85,3);
            *(undefined1 (*) [16])(pauVar37[7] + 8) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar84,3);
            lVar21 = 0x100;
            iVar46 = 4;
          }
          else {
            auVar87 = vunpcklps_avx512f(pauVar54[4],pauVar54[5]);
            auVar88 = vunpckhps_avx512f(pauVar54[4],pauVar54[5]);
            auVar89 = vunpcklps_avx512f(pauVar54[6],pauVar54[7]);
            auVar90 = vunpckhps_avx512f(pauVar54[6],pauVar54[7]);
            auVar91 = vunpcklps_avx512f(pauVar54[8],pauVar54[9]);
            auVar92 = vunpckhps_avx512f(pauVar54[8],pauVar54[9]);
            auVar93 = vunpcklps_avx512f(pauVar54[10],pauVar54[0xb]);
            auVar94 = vunpckhps_avx512f(pauVar54[10],pauVar54[0xb]);
            auVar95 = vunpcklpd_avx512f(auVar83,auVar85);
            auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
            auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
            auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
            auVar86 = vunpcklpd_avx512f(auVar87,auVar89);
            auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
            auVar89 = vunpcklpd_avx512f(auVar88,auVar90);
            auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
            auVar90 = vunpcklpd_avx512f(auVar91,auVar93);
            auVar91 = vunpckhpd_avx512f(auVar91,auVar93);
            auVar93 = vunpcklpd_avx512f(auVar92,auVar94);
            auVar92 = vunpckhpd_avx512f(auVar92,auVar94);
            auVar94 = vshuff64x2_avx512f(auVar95,auVar86,0x88);
            auVar96 = vshuff64x2_avx512f(auVar90,auVar83,0x88);
            auVar97 = vshuff64x2_avx512f(auVar87,auVar91,0x88);
            auVar98 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
            auVar99 = vshuff64x2_avx512f(auVar93,auVar84,0x88);
            auVar100 = vshuff64x2_avx512f(auVar88,auVar92,0x88);
            auVar86 = vshuff64x2_avx512f(auVar95,auVar86,0xdd);
            auVar95 = vshuff64x2_avx512f(auVar90,auVar83,0xdd);
            auVar87 = vshuff64x2_avx512f(auVar87,auVar91,0xdd);
            auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
            auVar89 = vshuff64x2_avx512f(auVar93,auVar84,0xdd);
            auVar88 = vshuff64x2_avx512f(auVar88,auVar92,0xdd);
            auVar91 = vshuff64x2_avx512f(auVar94,auVar96,0x88);
            auVar92 = vshuff64x2_avx512f(auVar97,auVar98,0x88);
            auVar101 = vshuff64x2_avx512f(auVar99,auVar100,0x88);
            auVar102 = vshuff64x2_avx512f(auVar86,auVar95,0x88);
            auVar103 = vshuff64x2_avx512f(auVar87,auVar85,0x88);
            auVar104 = vshuff64x2_avx512f(auVar89,auVar88,0x88);
            auVar94 = vshuff64x2_avx512f(auVar94,auVar96,0xdd);
            auVar96 = vshuff64x2_avx512f(auVar97,auVar98,0xdd);
            auVar97 = vshuff64x2_avx512f(auVar99,auVar100,0xdd);
            auVar86 = vshuff64x2_avx512f(auVar86,auVar95,0xdd);
            auVar85 = vshuff64x2_avx512f(auVar87,auVar85,0xdd);
            auVar87 = vshuff64x2_avx512f(auVar89,auVar88,0xdd);
            *(undefined1 (*) [32])(*pauVar37 + 0x10) = auVar91._0_32_;
            *(undefined1 (*) [16])(*pauVar37 + 0x30) = auVar90._0_16_;
            *(undefined1 (*) [16])(pauVar37[1] + 0x10) = auVar83._0_16_;
            *(undefined1 (*) [32])(pauVar37[1] + 0x20) = auVar92._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar92,1);
            *(undefined1 (*) [32])(pauVar37[2] + 0x10) = auVar71;
            *(undefined1 (*) [16])(pauVar37[2] + 0x30) = auVar93._0_16_;
            *(undefined1 (*) [16])(pauVar37[3] + 0x10) = auVar84._0_16_;
            auVar71 = vextractf64x4_avx512f(auVar101,1);
            *(undefined1 (*) [32])(pauVar37[3] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[4] + 0x10) = auVar102._0_32_;
            auVar57 = vextractf32x4_avx512f(auVar90,1);
            *(undefined1 (*) [16])(pauVar37[2] + 0x18) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar83,1);
            *(undefined1 (*) [16])(pauVar37[2] + 0x28) = auVar57;
            *(undefined1 (*) [32])(pauVar37[5] + 0x20) = auVar103._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar103,1);
            *(undefined1 (*) [32])(pauVar37[6] + 0x10) = auVar71;
            auVar57 = vextractf32x4_avx512f(auVar93,1);
            *(undefined1 (*) [16])(pauVar37[3] + 0x18) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar84,1);
            *(undefined1 (*) [16])(pauVar37[3] + 0x28) = auVar57;
            auVar71 = vextractf64x4_avx512f(auVar104,1);
            *(undefined1 (*) [32])(pauVar37[7] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[8] + 0x10) = auVar94._0_32_;
            auVar57 = vextractf32x4_avx512f(auVar90,2);
            *(undefined1 (*) [16])(pauVar37[4] + 0x18) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar83,2);
            *(undefined1 (*) [16])(pauVar37[4] + 0x28) = auVar57;
            *(undefined1 (*) [32])(pauVar37[9] + 0x20) = auVar96._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar96,1);
            *(undefined1 (*) [32])(pauVar37[10] + 0x10) = auVar71;
            auVar57 = vextractf32x4_avx512f(auVar93,2);
            *(undefined1 (*) [16])(pauVar37[5] + 0x18) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar84,2);
            *(undefined1 (*) [16])(pauVar37[5] + 0x28) = auVar57;
            auVar71 = vextractf64x4_avx512f(auVar97,1);
            *(undefined1 (*) [32])(pauVar37[0xb] + 0x20) = auVar71;
            *(undefined1 (*) [32])(pauVar37[0xc] + 0x10) = auVar86._0_32_;
            auVar57 = vextractf32x4_avx512f(auVar90,3);
            *(undefined1 (*) [16])(pauVar37[6] + 0x18) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar83,3);
            *(undefined1 (*) [16])(pauVar37[6] + 0x28) = auVar57;
            *(undefined1 (*) [32])(pauVar37[0xd] + 0x20) = auVar85._0_32_;
            auVar71 = vextractf64x4_avx512f(auVar85,1);
            *(undefined1 (*) [32])(pauVar37[0xe] + 0x10) = auVar71;
            auVar57 = vextractf32x4_avx512f(auVar93,3);
            *(undefined1 (*) [16])(pauVar37[7] + 0x18) = auVar57;
            auVar57 = vextractf32x4_avx512f(auVar84,3);
            auVar71 = vextractf64x4_avx512f(auVar87,1);
            *(undefined1 (*) [32])(pauVar37[0xf] + 0x20) = auVar71;
            lVar21 = 0x300;
            iVar46 = 0xc;
          }
          *(undefined1 (*) [16])(pauVar37[0xf] + 0x10) = auVar57;
        }
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + lVar21);
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar55 * 4);
      }
LAB_0044f50f:
      iVar24 = iVar46 + 3;
      pauVar43 = pauVar37 + 0xf;
      for (; iVar46 + 0xf < max_jj; iVar46 = iVar46 + 0x10) {
        auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
        auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
        auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
        auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
        auVar87 = vunpcklps_avx512f(pauVar54[4],pauVar54[5]);
        auVar88 = vunpckhps_avx512f(pauVar54[4],pauVar54[5]);
        auVar89 = vunpcklps_avx512f(pauVar54[6],pauVar54[7]);
        auVar90 = vunpckhps_avx512f(pauVar54[6],pauVar54[7]);
        auVar91 = vunpcklps_avx512f(pauVar54[8],pauVar54[9]);
        auVar92 = vunpckhps_avx512f(pauVar54[8],pauVar54[9]);
        auVar93 = vunpcklps_avx512f(pauVar54[10],pauVar54[0xb]);
        auVar94 = vunpckhps_avx512f(pauVar54[10],pauVar54[0xb]);
        auVar95 = vunpcklps_avx512f(pauVar54[0xc],pauVar54[0xd]);
        auVar96 = vunpckhps_avx512f(pauVar54[0xc],pauVar54[0xd]);
        auVar97 = vunpcklps_avx512f(pauVar54[0xe],pauVar54[0xf]);
        auVar98 = vunpckhps_avx512f(pauVar54[0xe],pauVar54[0xf]);
        auVar99 = vunpcklpd_avx512f(auVar83,auVar85);
        auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
        auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
        auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
        auVar86 = vunpcklpd_avx512f(auVar87,auVar89);
        auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
        auVar89 = vunpcklpd_avx512f(auVar88,auVar90);
        auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
        auVar90 = vunpcklpd_avx512f(auVar91,auVar93);
        auVar91 = vunpckhpd_avx512f(auVar91,auVar93);
        auVar93 = vunpcklpd_avx512f(auVar92,auVar94);
        auVar92 = vunpckhpd_avx512f(auVar92,auVar94);
        auVar94 = vunpcklpd_avx512f(auVar95,auVar97);
        auVar95 = vunpckhpd_avx512f(auVar95,auVar97);
        auVar97 = vunpcklpd_avx512f(auVar96,auVar98);
        auVar96 = vunpckhpd_avx512f(auVar96,auVar98);
        auVar98 = vshuff64x2_avx512f(auVar99,auVar86,0x88);
        auVar100 = vshuff64x2_avx512f(auVar90,auVar94,0x88);
        auVar101 = vshuff64x2_avx512f(auVar83,auVar87,0x88);
        auVar102 = vshuff64x2_avx512f(auVar91,auVar95,0x88);
        auVar103 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
        auVar104 = vshuff64x2_avx512f(auVar93,auVar97,0x88);
        auVar105 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
        auVar106 = vshuff64x2_avx512f(auVar92,auVar96,0x88);
        auVar86 = vshuff64x2_avx512f(auVar99,auVar86,0xdd);
        auVar90 = vshuff64x2_avx512f(auVar90,auVar94,0xdd);
        auVar83 = vshuff64x2_avx512f(auVar83,auVar87,0xdd);
        auVar87 = vshuff64x2_avx512f(auVar91,auVar95,0xdd);
        auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
        auVar89 = vshuff64x2_avx512f(auVar93,auVar97,0xdd);
        auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
        auVar88 = vshuff64x2_avx512f(auVar92,auVar96,0xdd);
        auVar91 = vshuff64x2_avx512f(auVar98,auVar100,0x88);
        auVar92 = vshuff64x2_avx512f(auVar101,auVar102,0x88);
        auVar93 = vshuff64x2_avx512f(auVar103,auVar104,0x88);
        auVar94 = vshuff64x2_avx512f(auVar105,auVar106,0x88);
        auVar95 = vshuff64x2_avx512f(auVar86,auVar90,0x88);
        auVar96 = vshuff64x2_avx512f(auVar83,auVar87,0x88);
        auVar97 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
        auVar99 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
        auVar98 = vshuff64x2_avx512f(auVar98,auVar100,0xdd);
        auVar100 = vshuff64x2_avx512f(auVar101,auVar102,0xdd);
        auVar101 = vshuff64x2_avx512f(auVar103,auVar104,0xdd);
        auVar102 = vshuff64x2_avx512f(auVar105,auVar106,0xdd);
        auVar86 = vshuff64x2_avx512f(auVar86,auVar90,0xdd);
        auVar83 = vshuff64x2_avx512f(auVar83,auVar87,0xdd);
        auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
        auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
        *pauVar37 = auVar91;
        pauVar37[1] = auVar92;
        pauVar37[2] = auVar93;
        pauVar37[3] = auVar94;
        pauVar37[4] = auVar95;
        pauVar37[5] = auVar96;
        pauVar37[6] = auVar97;
        pauVar37[7] = auVar99;
        pauVar37[8] = auVar98;
        pauVar37[9] = auVar100;
        pauVar37[10] = auVar101;
        pauVar37[0xb] = auVar102;
        pauVar37[0xc] = auVar86;
        pauVar37[0xd] = auVar83;
        pauVar37[0xe] = auVar85;
        pauVar37[0xf] = auVar84;
        pauVar54 = pauVar54 + 0x10;
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar20);
        iVar24 = iVar24 + 0x10;
        pauVar43 = (undefined1 (*) [64])(*pauVar43 + lVar20);
      }
      for (; iVar46 + 0xb < max_jj; iVar46 = iVar46 + 0xc) {
        auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
        auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
        auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
        auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
        auVar87 = vunpcklps_avx512f(pauVar54[4],pauVar54[5]);
        auVar88 = vunpckhps_avx512f(pauVar54[4],pauVar54[5]);
        auVar89 = vunpcklps_avx512f(pauVar54[6],pauVar54[7]);
        auVar90 = vunpckhps_avx512f(pauVar54[6],pauVar54[7]);
        auVar91 = vunpcklps_avx512f(pauVar54[8],pauVar54[9]);
        auVar92 = vunpckhps_avx512f(pauVar54[8],pauVar54[9]);
        auVar93 = vunpcklps_avx512f(pauVar54[10],pauVar54[0xb]);
        auVar94 = vunpckhps_avx512f(pauVar54[10],pauVar54[0xb]);
        auVar95 = vunpcklpd_avx512f(auVar83,auVar85);
        auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
        auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
        auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
        auVar86 = vunpcklpd_avx512f(auVar87,auVar89);
        auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
        auVar89 = vunpcklpd_avx512f(auVar88,auVar90);
        auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
        auVar90 = vunpcklpd_avx512f(auVar91,auVar93);
        auVar91 = vunpckhpd_avx512f(auVar91,auVar93);
        auVar93 = vunpcklpd_avx512f(auVar92,auVar94);
        auVar92 = vunpckhpd_avx512f(auVar92,auVar94);
        auVar94 = vshuff64x2_avx512f(auVar95,auVar86,0x88);
        auVar96 = vshuff64x2_avx512f(auVar90,auVar83,0x88);
        auVar97 = vshuff64x2_avx512f(auVar87,auVar91,0x88);
        auVar98 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
        auVar99 = vshuff64x2_avx512f(auVar93,auVar84,0x88);
        auVar100 = vshuff64x2_avx512f(auVar88,auVar92,0x88);
        auVar86 = vshuff64x2_avx512f(auVar95,auVar86,0xdd);
        auVar95 = vshuff64x2_avx512f(auVar90,auVar83,0xdd);
        auVar87 = vshuff64x2_avx512f(auVar87,auVar91,0xdd);
        auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
        auVar89 = vshuff64x2_avx512f(auVar93,auVar84,0xdd);
        auVar88 = vshuff64x2_avx512f(auVar88,auVar92,0xdd);
        auVar91 = vshuff64x2_avx512f(auVar94,auVar96,0x88);
        auVar92 = vshuff64x2_avx512f(auVar97,auVar98,0x88);
        auVar101 = vshuff64x2_avx512f(auVar99,auVar100,0x88);
        auVar102 = vshuff64x2_avx512f(auVar86,auVar95,0x88);
        auVar103 = vshuff64x2_avx512f(auVar87,auVar85,0x88);
        auVar104 = vshuff64x2_avx512f(auVar89,auVar88,0x88);
        auVar94 = vshuff64x2_avx512f(auVar94,auVar96,0xdd);
        auVar96 = vshuff64x2_avx512f(auVar97,auVar98,0xdd);
        auVar97 = vshuff64x2_avx512f(auVar99,auVar100,0xdd);
        auVar86 = vshuff64x2_avx512f(auVar86,auVar95,0xdd);
        auVar85 = vshuff64x2_avx512f(auVar87,auVar85,0xdd);
        auVar87 = vshuff64x2_avx512f(auVar89,auVar88,0xdd);
        *(undefined1 (*) [32])*pauVar37 = auVar91._0_32_;
        *(undefined1 (*) [16])(*pauVar37 + 0x20) = auVar90._0_16_;
        *(undefined1 (*) [16])pauVar37[1] = auVar83._0_16_;
        *(undefined1 (*) [32])(pauVar37[1] + 0x10) = auVar92._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar92,1);
        *(undefined1 (*) [32])pauVar37[2] = auVar71;
        *(undefined1 (*) [16])(pauVar37[2] + 0x20) = auVar93._0_16_;
        *(undefined1 (*) [16])pauVar37[3] = auVar84._0_16_;
        auVar71 = vextractf64x4_avx512f(auVar101,1);
        *(undefined1 (*) [32])(pauVar37[3] + 0x10) = auVar71;
        *(undefined1 (*) [32])pauVar37[4] = auVar102._0_32_;
        auVar57 = vextractf32x4_avx512f(auVar90,1);
        *(undefined1 (*) [16])(pauVar37[2] + 0x10) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,1);
        *(undefined1 (*) [16])(pauVar37[2] + 0x20) = auVar57;
        *(undefined1 (*) [32])(pauVar37[5] + 0x10) = auVar103._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar103,1);
        *(undefined1 (*) [32])pauVar37[6] = auVar71;
        auVar57 = vextractf32x4_avx512f(auVar93,1);
        *(undefined1 (*) [16])(pauVar37[3] + 0x10) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,1);
        *(undefined1 (*) [16])(pauVar37[3] + 0x20) = auVar57;
        auVar71 = vextractf64x4_avx512f(auVar104,1);
        *(undefined1 (*) [32])(pauVar37[7] + 0x10) = auVar71;
        *(undefined1 (*) [32])pauVar37[8] = auVar94._0_32_;
        auVar57 = vextractf32x4_avx512f(auVar90,2);
        *(undefined1 (*) [16])(pauVar37[4] + 0x10) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,2);
        *(undefined1 (*) [16])(pauVar37[4] + 0x20) = auVar57;
        *(undefined1 (*) [32])(pauVar37[9] + 0x10) = auVar96._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar96,1);
        *(undefined1 (*) [32])pauVar37[10] = auVar71;
        auVar57 = vextractf32x4_avx512f(auVar93,2);
        *(undefined1 (*) [16])(pauVar37[5] + 0x10) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,2);
        *(undefined1 (*) [16])(pauVar37[5] + 0x20) = auVar57;
        auVar71 = vextractf64x4_avx512f(auVar97,1);
        *(undefined1 (*) [32])(pauVar37[0xb] + 0x10) = auVar71;
        *(undefined1 (*) [32])pauVar37[0xc] = auVar86._0_32_;
        auVar57 = vextractf32x4_avx512f(auVar90,3);
        *(undefined1 (*) [16])(pauVar37[6] + 0x10) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,3);
        *(undefined1 (*) [16])(pauVar37[6] + 0x20) = auVar57;
        *(undefined1 (*) [32])(pauVar37[0xd] + 0x10) = auVar85._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar85,1);
        *(undefined1 (*) [32])pauVar37[0xe] = auVar71;
        auVar57 = vextractf32x4_avx512f(auVar93,3);
        *(undefined1 (*) [16])(pauVar37[7] + 0x10) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,3);
        *(undefined1 (*) [16])(pauVar37[7] + 0x20) = auVar57;
        auVar71 = vextractf64x4_avx512f(auVar87,1);
        *(undefined1 (*) [32])(pauVar37[0xf] + 0x10) = auVar71;
        pauVar54 = pauVar54 + 0xc;
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar20);
        iVar24 = iVar24 + 0xc;
        pauVar43 = (undefined1 (*) [64])(*pauVar43 + lVar20);
      }
      for (; iVar46 + 7 < max_jj; iVar46 = iVar46 + 8) {
        auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
        auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
        auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
        auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
        auVar87 = vunpcklps_avx512f(pauVar54[4],pauVar54[5]);
        auVar88 = vunpckhps_avx512f(pauVar54[4],pauVar54[5]);
        auVar89 = vunpcklps_avx512f(pauVar54[6],pauVar54[7]);
        auVar90 = vunpckhps_avx512f(pauVar54[6],pauVar54[7]);
        auVar91 = vunpcklpd_avx512f(auVar83,auVar85);
        auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
        auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
        auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
        auVar86 = vunpcklpd_avx512f(auVar87,auVar89);
        auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
        auVar89 = vunpcklpd_avx512f(auVar88,auVar90);
        auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
        auVar90 = vshuff64x2_avx512f(auVar91,auVar86,0x88);
        auVar92 = vshuff64x2_avx512f(auVar83,auVar87,0x88);
        auVar93 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
        auVar94 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
        auVar86 = vshuff64x2_avx512f(auVar91,auVar86,0xdd);
        auVar83 = vshuff64x2_avx512f(auVar83,auVar87,0xdd);
        auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
        auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
        auVar87 = vshuff64x2_avx512f(auVar90,auVar92,0x88);
        auVar88 = vshuff64x2_avx512f(auVar93,auVar94,0x88);
        auVar89 = vshuff64x2_avx512f(auVar86,auVar83,0x88);
        auVar91 = vshuff64x2_avx512f(auVar85,auVar84,0x88);
        auVar90 = vshuff64x2_avx512f(auVar90,auVar92,0xdd);
        auVar92 = vshuff64x2_avx512f(auVar93,auVar94,0xdd);
        auVar83 = vshuff64x2_avx512f(auVar86,auVar83,0xdd);
        auVar84 = vshuff64x2_avx512f(auVar85,auVar84,0xdd);
        *(undefined1 (*) [32])*pauVar37 = auVar87._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar87,1);
        *(undefined1 (*) [32])pauVar37[1] = auVar71;
        *(undefined1 (*) [32])pauVar37[2] = auVar88._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar88,1);
        *(undefined1 (*) [32])pauVar37[3] = auVar71;
        *(undefined1 (*) [32])pauVar37[4] = auVar89._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar89,1);
        *(undefined1 (*) [32])pauVar37[5] = auVar71;
        *(undefined1 (*) [32])pauVar37[6] = auVar91._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar91,1);
        *(undefined1 (*) [32])pauVar37[7] = auVar71;
        *(undefined1 (*) [32])pauVar37[8] = auVar90._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar90,1);
        *(undefined1 (*) [32])pauVar37[9] = auVar71;
        *(undefined1 (*) [32])pauVar37[10] = auVar92._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar92,1);
        *(undefined1 (*) [32])pauVar37[0xb] = auVar71;
        *(undefined1 (*) [32])pauVar37[0xc] = auVar83._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar83,1);
        *(undefined1 (*) [32])pauVar37[0xd] = auVar71;
        *(undefined1 (*) [32])pauVar37[0xe] = auVar84._0_32_;
        auVar71 = vextractf64x4_avx512f(auVar84,1);
        *(undefined1 (*) [32])pauVar37[0xf] = auVar71;
        pauVar54 = pauVar54 + 8;
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar20);
        iVar24 = iVar24 + 8;
        pauVar43 = (undefined1 (*) [64])(*pauVar43 + lVar20);
      }
      for (; iVar24 < max_jj; iVar24 = iVar24 + 4) {
        auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
        auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
        auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
        auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
        auVar87 = vunpcklpd_avx512f(auVar83,auVar85);
        auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
        auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
        auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
        *(undefined1 (*) [16])pauVar43[-0xf] = auVar87._0_16_;
        *(undefined1 (*) [16])pauVar43[-0xe] = auVar83._0_16_;
        *(undefined1 (*) [16])pauVar43[-0xd] = auVar85._0_16_;
        *(undefined1 (*) [16])pauVar43[-0xc] = auVar84._0_16_;
        auVar57 = vextractf32x4_avx512f(auVar87,1);
        *(undefined1 (*) [16])(pauVar43[-6] + 0x20) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,1);
        *(undefined1 (*) [16])pauVar43[-5] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,1);
        *(undefined1 (*) [16])(pauVar43[-5] + 0x20) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,1);
        *(undefined1 (*) [16])pauVar43[-4] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar87,2);
        *(undefined1 (*) [16])(pauVar43[-4] + 0x20) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,2);
        *(undefined1 (*) [16])pauVar43[-3] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,2);
        *(undefined1 (*) [16])(pauVar43[-3] + 0x20) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,2);
        *(undefined1 (*) [16])pauVar43[-2] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar87,3);
        *(undefined1 (*) [16])(pauVar43[-2] + 0x20) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,3);
        *(undefined1 (*) [16])pauVar43[-1] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,3);
        *(undefined1 (*) [16])(pauVar43[-1] + 0x20) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,3);
        *(undefined1 (*) [16])*pauVar43 = auVar57;
        pauVar54 = pauVar54 + 4;
        pauVar43 = (undefined1 (*) [64])(*pauVar43 + lVar20);
      }
    }
    if (iVar2 == 8) {
      pauVar37 = (undefined1 (*) [64])((long)top_blob->data + (lVar30 + uVar38) * 0x20 + lVar19 * 4)
      ;
      iVar46 = 0;
      if (uVar50 == 4) {
        auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
        auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
        auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
        auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
        auVar87 = vunpcklpd_avx512f(auVar83,auVar85);
        auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
        auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
        auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
        *(undefined1 (*) [16])(*pauVar37 + 0x10) = auVar87._0_16_;
        *(undefined1 (*) [16])(*pauVar37 + 0x30) = auVar83._0_16_;
        *(undefined1 (*) [16])(pauVar37[1] + 0x10) = auVar85._0_16_;
        *(undefined1 (*) [16])(pauVar37[1] + 0x30) = auVar84._0_16_;
        auVar57 = vextractf32x4_avx512f(auVar87,1);
        *(undefined1 (*) [16])(pauVar37[1] + 8) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,1);
        *(undefined1 (*) [16])(pauVar37[1] + 0x18) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,1);
        *(undefined1 (*) [16])(pauVar37[1] + 0x28) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,1);
        *(undefined1 (*) [16])(pauVar37[1] + 0x38) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar87,2);
        *(undefined1 (*) [16])(pauVar37[2] + 8) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,2);
        *(undefined1 (*) [16])(pauVar37[2] + 0x18) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,2);
        *(undefined1 (*) [16])(pauVar37[2] + 0x28) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,2);
        *(undefined1 (*) [16])(pauVar37[2] + 0x38) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar87,3);
        *(undefined1 (*) [16])(pauVar37[3] + 8) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,3);
        *(undefined1 (*) [16])(pauVar37[3] + 0x18) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,3);
        *(undefined1 (*) [16])(pauVar37[3] + 0x28) = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,3);
        *(undefined1 (*) [16])(pauVar37[3] + 0x38) = auVar57;
        pauVar54 = pauVar54 + 4;
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar36 * 4);
        iVar46 = 4;
      }
      iVar24 = iVar46 + 3;
      pauVar40 = (undefined1 (*) [16])(pauVar37[7] + 0x20);
      for (; iVar46 + 7 < max_jj; iVar46 = iVar46 + 8) {
        auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
        auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
        auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
        auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
        auVar87 = vunpcklps_avx512f(pauVar54[4],pauVar54[5]);
        auVar88 = vunpckhps_avx512f(pauVar54[4],pauVar54[5]);
        auVar89 = vunpcklps_avx512f(pauVar54[6],pauVar54[7]);
        auVar90 = vunpckhps_avx512f(pauVar54[6],pauVar54[7]);
        auVar91 = vunpcklpd_avx512f(auVar83,auVar85);
        auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
        auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
        auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
        auVar86 = vunpcklpd_avx512f(auVar87,auVar89);
        auVar87 = vunpckhpd_avx512f(auVar87,auVar89);
        auVar89 = vunpcklpd_avx512f(auVar88,auVar90);
        auVar88 = vunpckhpd_avx512f(auVar88,auVar90);
        auVar90 = vshuff64x2_avx512f(auVar91,auVar86,0x88);
        auVar92 = vshuff64x2_avx512f(auVar83,auVar87,0x88);
        auVar93 = vshuff64x2_avx512f(auVar85,auVar89,0x88);
        auVar94 = vshuff64x2_avx512f(auVar84,auVar88,0x88);
        auVar86 = vshuff64x2_avx512f(auVar91,auVar86,0xdd);
        auVar83 = vshuff64x2_avx512f(auVar83,auVar87,0xdd);
        auVar85 = vshuff64x2_avx512f(auVar85,auVar89,0xdd);
        auVar84 = vshuff64x2_avx512f(auVar84,auVar88,0xdd);
        auVar87 = vshuff64x2_avx512f(auVar90,auVar92,0x88);
        auVar88 = vshuff64x2_avx512f(auVar93,auVar94,0x88);
        auVar89 = vshuff64x2_avx512f(auVar86,auVar83,0x88);
        auVar91 = vshuff64x2_avx512f(auVar85,auVar84,0x88);
        auVar90 = vshuff64x2_avx512f(auVar90,auVar92,0xdd);
        auVar92 = vshuff64x2_avx512f(auVar93,auVar94,0xdd);
        auVar83 = vshuff64x2_avx512f(auVar86,auVar83,0xdd);
        auVar84 = vshuff64x2_avx512f(auVar85,auVar84,0xdd);
        *pauVar37 = auVar87;
        pauVar37[1] = auVar88;
        pauVar37[2] = auVar89;
        pauVar37[3] = auVar91;
        pauVar37[4] = auVar90;
        pauVar37[5] = auVar92;
        pauVar37[6] = auVar83;
        pauVar37[7] = auVar84;
        pauVar54 = pauVar54 + 8;
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar1);
        iVar24 = iVar24 + 8;
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar1);
      }
      for (; iVar24 < max_jj; iVar24 = iVar24 + 4) {
        auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
        auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
        auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
        auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
        auVar87 = vunpcklpd_avx512f(auVar83,auVar85);
        auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
        auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
        auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
        pauVar40[-0x1e] = auVar87._0_16_;
        pauVar40[-0x1c] = auVar83._0_16_;
        pauVar40[-0x1a] = auVar85._0_16_;
        pauVar40[-0x18] = auVar84._0_16_;
        auVar57 = vextractf32x4_avx512f(auVar87,1);
        pauVar40[-0xb] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,1);
        pauVar40[-10] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,1);
        pauVar40[-9] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,1);
        pauVar40[-8] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar87,2);
        pauVar40[-7] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,2);
        pauVar40[-6] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,2);
        pauVar40[-5] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,2);
        pauVar40[-4] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar87,3);
        pauVar40[-3] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar83,3);
        pauVar40[-2] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar85,3);
        pauVar40[-1] = auVar57;
        auVar57 = vextractf32x4_avx512f(auVar84,3);
        *pauVar40 = auVar57;
        pauVar54 = pauVar54 + 4;
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar1);
      }
    }
    if (iVar2 == 4) {
      pauVar37 = (undefined1 (*) [64])((long)top_blob->data + local_108);
      for (iVar46 = 3; iVar46 < max_jj; iVar46 = iVar46 + 4) {
        auVar83 = vunpcklps_avx512f(*pauVar54,pauVar54[1]);
        auVar84 = vunpckhps_avx512f(*pauVar54,pauVar54[1]);
        auVar85 = vunpcklps_avx512f(pauVar54[2],pauVar54[3]);
        auVar86 = vunpckhps_avx512f(pauVar54[2],pauVar54[3]);
        auVar87 = vunpcklpd_avx512f(auVar83,auVar85);
        auVar83 = vunpckhpd_avx512f(auVar83,auVar85);
        auVar85 = vunpcklpd_avx512f(auVar84,auVar86);
        auVar84 = vunpckhpd_avx512f(auVar84,auVar86);
        auVar86 = vshuff64x2_avx512f(auVar87,auVar83,0x88);
        auVar88 = vshuff64x2_avx512f(auVar85,auVar84,0x88);
        auVar83 = vshuff64x2_avx512f(auVar87,auVar83,0xdd);
        auVar84 = vshuff64x2_avx512f(auVar85,auVar84,0xdd);
        auVar85 = vshuff64x2_avx512f(auVar86,auVar88,0x88);
        auVar87 = vshuff64x2_avx512f(auVar83,auVar84,0x88);
        auVar86 = vshuff64x2_avx512f(auVar86,auVar88,0xdd);
        auVar83 = vshuff64x2_avx512f(auVar83,auVar84,0xdd);
        pauVar37[-3] = auVar85;
        pauVar37[-2] = auVar87;
        pauVar37[-1] = auVar86;
        *pauVar37 = auVar83;
        pauVar54 = pauVar54 + 4;
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar53);
      }
    }
    if (iVar2 == 1) {
      pauVar37 = (undefined1 (*) [64])((long)top_blob->data + lVar26);
      iVar46 = iVar29;
      while (bVar56 = iVar46 != 0, iVar46 = iVar46 + -1, bVar56) {
        *pauVar37 = *pauVar54;
        pauVar54 = pauVar54 + 1;
        pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar32);
      }
    }
    lVar51 = lVar51 + 0x100;
    lVar26 = lVar26 + 0x40;
    lVar42 = lVar42 + 0x100;
    lVar48 = lVar48 + 0x40;
    lVar34 = lVar34 + 0x100;
    local_b0 = local_b0 + 0x100;
    local_108 = local_108 + 0x100;
  }
  lVar18 = lVar18 * 4;
  for (; (long)(uVar38 | 7) < lVar25; uVar38 = uVar38 + 8) {
    if (iVar2 == 0x10) {
      pauVar39 = (undefined1 (*) [32])((long)top_blob->data + (uVar38 + lVar30) * 0x40 + lVar18);
      if (uVar28 == 0xc) {
        auVar71 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                               *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                               *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar107 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar9 = vunpcklpd_avx(auVar71,auVar7);
        auVar71 = vunpckhpd_avx(auVar71,auVar7);
        auVar7 = vunpcklpd_avx(auVar6,auVar107);
        auVar6 = vunpckhpd_avx(auVar6,auVar107);
        *(undefined1 (*) [16])(pauVar39[1] + 0x10) = auVar9._0_16_;
        *(undefined1 (*) [16])(pauVar39[3] + 0x10) = auVar71._0_16_;
        *(undefined1 (*) [16])(pauVar39[5] + 0x10) = auVar7._0_16_;
        *(undefined1 (*) [16])(pauVar39[7] + 0x10) = auVar6._0_16_;
        *(undefined1 (*) [16])(pauVar39[9] + 0x10) = auVar9._16_16_;
        *(undefined1 (*) [16])(pauVar39[0xb] + 0x10) = auVar71._16_16_;
        *(undefined1 (*) [16])(pauVar39[0xd] + 0x10) = auVar7._16_16_;
        *(undefined1 (*) [16])(pauVar39[0xf] + 0x10) = auVar6._16_16_;
        pauVar54 = pauVar54 + 2;
        pauVar39 = (undefined1 (*) [32])(*pauVar39 + lVar55 * 4);
        iVar46 = 4;
      }
      else {
        if (uVar28 == 8) {
          auVar107 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                   *(undefined1 (*) [32])(*pauVar54 + 0x20));
          auVar71 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                                  *(undefined1 (*) [32])(*pauVar54 + 0x20));
          auVar9 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
          if (max_jj < 5) {
            auVar7 = vunpcklpd_avx(auVar107,auVar9);
            auVar107 = vunpckhpd_avx(auVar107,auVar9);
            auVar9 = vunpcklpd_avx(auVar71,auVar6);
            auVar71 = vunpckhpd_avx(auVar71,auVar6);
            *(undefined1 (*) [16])pauVar39[1] = auVar7._0_16_;
            *(undefined1 (*) [16])pauVar39[3] = auVar107._0_16_;
            *(undefined1 (*) [16])pauVar39[5] = auVar9._0_16_;
            *(undefined1 (*) [16])pauVar39[7] = auVar71._0_16_;
            *(undefined1 (*) [16])pauVar39[9] = auVar7._16_16_;
            *(undefined1 (*) [16])pauVar39[0xb] = auVar107._16_16_;
            *(undefined1 (*) [16])pauVar39[0xd] = auVar9._16_16_;
            *(undefined1 (*) [16])pauVar39[0xf] = auVar71._16_16_;
            lVar21 = 0x80;
            iVar46 = 4;
          }
          else {
            auVar82 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[2],
                                    *(undefined1 (*) [32])(pauVar54[2] + 0x20));
            auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[2],
                                   *(undefined1 (*) [32])(pauVar54[2] + 0x20));
            auVar110 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[3],
                                     *(undefined1 (*) [32])(pauVar54[3] + 0x20));
            auVar109 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[3],
                                     *(undefined1 (*) [32])(pauVar54[3] + 0x20));
            auVar108 = vunpcklpd_avx(auVar107,auVar9);
            auVar107 = vunpckhpd_avx(auVar107,auVar9);
            auVar112 = vunpcklpd_avx(auVar71,auVar6);
            auVar71 = vunpckhpd_avx(auVar71,auVar6);
            auVar8 = vunpcklpd_avx(auVar82,auVar110);
            auVar6 = vunpckhpd_avx(auVar82,auVar110);
            auVar82 = vunpcklpd_avx(auVar7,auVar109);
            auVar9 = vunpckhpd_avx(auVar7,auVar109);
            auVar109._16_16_ = auVar8._0_16_;
            auVar109._0_16_ = auVar108._0_16_;
            auVar110._16_16_ = auVar6._0_16_;
            auVar110._0_16_ = auVar107._0_16_;
            auVar113._16_16_ = auVar82._0_16_;
            auVar113._0_16_ = auVar112._0_16_;
            auVar116._16_16_ = auVar9._0_16_;
            auVar116._0_16_ = auVar71._0_16_;
            auVar7 = vperm2f128_avx(auVar108,auVar8,0x31);
            auVar6 = vperm2f128_avx(auVar107,auVar6,0x31);
            auVar107 = vperm2f128_avx(auVar112,auVar82,0x31);
            auVar71 = vperm2f128_avx(auVar71,auVar9,0x31);
            pauVar39[1] = auVar109;
            pauVar39[3] = auVar110;
            pauVar39[5] = auVar113;
            pauVar39[7] = auVar116;
            pauVar39[9] = auVar7;
            pauVar39[0xb] = auVar6;
            pauVar39[0xd] = auVar107;
            pauVar39[0xf] = auVar71;
            lVar21 = 0x100;
            iVar46 = 8;
          }
        }
        else {
          iVar46 = 0;
          if (uVar28 != 4) goto LAB_00450694;
          auVar107 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                   *(undefined1 (*) [32])(*pauVar54 + 0x20));
          auVar71 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                                  *(undefined1 (*) [32])(*pauVar54 + 0x20));
          auVar9 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
          auVar6 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
          if (max_jj < 5) {
            auVar7 = vunpcklpd_avx(auVar107,auVar9);
            auVar107 = vunpckhpd_avx(auVar107,auVar9);
            auVar9 = vunpcklpd_avx(auVar71,auVar6);
            auVar71 = vunpckhpd_avx(auVar71,auVar6);
            *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar7._0_16_;
            *(undefined1 (*) [16])(pauVar39[2] + 0x10) = auVar107._0_16_;
            *(undefined1 (*) [16])(pauVar39[4] + 0x10) = auVar9._0_16_;
            *(undefined1 (*) [16])(pauVar39[6] + 0x10) = auVar71._0_16_;
            *(undefined1 (*) [16])(pauVar39[8] + 0x10) = auVar7._16_16_;
            *(undefined1 (*) [16])(pauVar39[10] + 0x10) = auVar107._16_16_;
            *(undefined1 (*) [16])(pauVar39[0xc] + 0x10) = auVar9._16_16_;
            auVar57 = auVar71._16_16_;
            lVar21 = 0x80;
            iVar46 = 4;
          }
          else {
            auVar113 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[2],
                                     *(undefined1 (*) [32])(pauVar54[2] + 0x20));
            auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[2],
                                   *(undefined1 (*) [32])(pauVar54[2] + 0x20));
            auVar116 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[3],
                                     *(undefined1 (*) [32])(pauVar54[3] + 0x20));
            auVar109 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[3],
                                     *(undefined1 (*) [32])(pauVar54[3] + 0x20));
            auVar114 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[4],
                                     *(undefined1 (*) [32])(pauVar54[4] + 0x20));
            auVar108 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[4],
                                     *(undefined1 (*) [32])(pauVar54[4] + 0x20));
            auVar75 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[5],
                                    *(undefined1 (*) [32])(pauVar54[5] + 0x20));
            auVar112 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[5],
                                     *(undefined1 (*) [32])(pauVar54[5] + 0x20));
            auVar8 = vunpcklpd_avx(auVar107,auVar9);
            auVar107 = vunpckhpd_avx(auVar107,auVar9);
            auVar82 = vunpcklpd_avx(auVar71,auVar6);
            auVar71 = vunpckhpd_avx(auVar71,auVar6);
            auVar110 = vunpcklpd_avx(auVar113,auVar116);
            auVar6 = vunpckhpd_avx(auVar113,auVar116);
            auVar113 = vunpcklpd_avx(auVar7,auVar109);
            auVar9 = vunpckhpd_avx(auVar7,auVar109);
            auVar116 = vunpcklpd_avx(auVar114,auVar75);
            auVar7 = vunpckhpd_avx(auVar114,auVar75);
            auVar114 = vunpcklpd_avx(auVar108,auVar112);
            auVar109 = vunpckhpd_avx(auVar108,auVar112);
            auVar112._16_16_ = auVar110._0_16_;
            auVar112._0_16_ = auVar8._0_16_;
            auVar75._16_16_ = auVar7._0_16_;
            auVar75._0_16_ = auVar6._0_16_;
            auVar72._16_16_ = auVar113._0_16_;
            auVar72._0_16_ = auVar82._0_16_;
            auVar73._16_16_ = auVar109._0_16_;
            auVar73._0_16_ = auVar9._0_16_;
            auVar108 = vperm2f128_avx(auVar8,auVar110,0x31);
            auVar6 = vperm2f128_avx(auVar6,auVar7,0x31);
            auVar7 = vperm2f128_avx(auVar82,auVar113,0x31);
            auVar9 = vperm2f128_avx(auVar9,auVar109,0x31);
            *(undefined1 (*) [32])(*pauVar39 + 0x10) = auVar112;
            *(undefined1 (*) [16])(pauVar39[1] + 0x10) = auVar116._0_16_;
            *(undefined1 (*) [16])(pauVar39[2] + 0x10) = auVar107._0_16_;
            pauVar39[3] = auVar75;
            *(undefined1 (*) [32])(pauVar39[4] + 0x10) = auVar72;
            *(undefined1 (*) [16])(pauVar39[5] + 0x10) = auVar114._0_16_;
            *(undefined1 (*) [16])(pauVar39[6] + 0x10) = auVar71._0_16_;
            pauVar39[7] = auVar73;
            *(undefined1 (*) [32])(pauVar39[8] + 0x10) = auVar108;
            *(undefined1 (*) [16])(pauVar39[9] + 0x10) = auVar116._16_16_;
            *(undefined1 (*) [16])(pauVar39[10] + 0x10) = auVar107._16_16_;
            pauVar39[0xb] = auVar6;
            *(undefined1 (*) [32])(pauVar39[0xc] + 0x10) = auVar7;
            *(undefined1 (*) [16])(pauVar39[0xd] + 0x10) = auVar114._16_16_;
            auVar57 = auVar71._16_16_;
            pauVar39[0xf] = auVar9;
            lVar21 = 0x180;
            iVar46 = 0xc;
          }
          *(undefined1 (*) [16])(pauVar39[0xe] + 0x10) = auVar57;
        }
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + lVar21);
        pauVar39 = (undefined1 (*) [32])(*pauVar39 + lVar55 * 4);
      }
LAB_00450694:
      iVar24 = iVar46 + 3;
      pauVar44 = pauVar39 + 0xe;
      for (; iVar46 + 0xf < max_jj; iVar46 = iVar46 + 0x10) {
        auVar72 = vunpcklps_avx512vl(*(undefined1 (*) [32])*pauVar54,
                                     *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar71 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                                *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar8 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                               *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar6 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                               *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar82 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[2],
                                *(undefined1 (*) [32])(pauVar54[2] + 0x20));
        auVar107 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[2],
                                 *(undefined1 (*) [32])(pauVar54[2] + 0x20));
        auVar110 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[3],
                                 *(undefined1 (*) [32])(pauVar54[3] + 0x20));
        auVar9 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[3],
                               *(undefined1 (*) [32])(pauVar54[3] + 0x20));
        auVar113 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[4],
                                 *(undefined1 (*) [32])(pauVar54[4] + 0x20));
        auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[4],
                               *(undefined1 (*) [32])(pauVar54[4] + 0x20));
        auVar116 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[5],
                                 *(undefined1 (*) [32])(pauVar54[5] + 0x20));
        auVar109 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[5],
                                 *(undefined1 (*) [32])(pauVar54[5] + 0x20));
        auVar114 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[6],
                                 *(undefined1 (*) [32])(pauVar54[6] + 0x20));
        auVar108 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[6],
                                 *(undefined1 (*) [32])(pauVar54[6] + 0x20));
        auVar75 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[7],
                                *(undefined1 (*) [32])(pauVar54[7] + 0x20));
        auVar112 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[7],
                                 *(undefined1 (*) [32])(pauVar54[7] + 0x20));
        auVar73 = vunpcklpd_avx512vl(auVar72,auVar8);
        auVar72 = vunpckhpd_avx512vl(auVar72,auVar8);
        auVar74 = vunpcklpd_avx512vl(auVar71,auVar6);
        auVar71 = vunpckhpd_avx(auVar71,auVar6);
        auVar8 = vunpcklpd_avx(auVar82,auVar110);
        auVar6 = vunpckhpd_avx(auVar82,auVar110);
        auVar82 = vunpcklpd_avx(auVar107,auVar9);
        auVar107 = vunpckhpd_avx(auVar107,auVar9);
        auVar110 = vunpcklpd_avx(auVar113,auVar116);
        auVar9 = vunpckhpd_avx(auVar113,auVar116);
        auVar113 = vunpcklpd_avx(auVar7,auVar109);
        auVar7 = vunpckhpd_avx(auVar7,auVar109);
        auVar116 = vunpcklpd_avx(auVar114,auVar75);
        auVar109 = vunpckhpd_avx(auVar114,auVar75);
        auVar114 = vunpcklpd_avx(auVar108,auVar112);
        auVar108 = vunpckhpd_avx(auVar108,auVar112);
        auVar118._16_16_ = auVar8._0_16_;
        auVar118._0_16_ = auVar73._0_16_;
        auVar75 = vinsertf32x4_avx512vl(auVar110,auVar116._0_16_,1);
        auVar76 = vinsertf32x4_avx512vl(auVar72,auVar6._0_16_,1);
        auVar77 = vinsertf32x4_avx512vl(auVar9,auVar109._0_16_,1);
        auVar78 = vinsertf32x4_avx512vl(auVar74,auVar82._0_16_,1);
        auVar79 = vinsertf32x4_avx512vl(auVar113,auVar114._0_16_,1);
        auVar80 = vinsertf32x4_avx512vl(auVar71,auVar107._0_16_,1);
        auVar81 = vinsertf32x4_avx512vl(auVar7,auVar108._0_16_,1);
        auVar112 = vperm2f128_avx(auVar73,auVar8,0x31);
        auVar8 = vperm2f128_avx(auVar110,auVar116,0x31);
        auVar6 = vperm2f128_avx(auVar72,auVar6,0x31);
        auVar9 = vperm2f128_avx(auVar9,auVar109,0x31);
        auVar82 = vshuff64x2_avx512vl(auVar74,auVar82,3);
        auVar109 = vperm2f128_avx(auVar113,auVar114,0x31);
        auVar71 = vperm2f128_avx(auVar71,auVar107,0x31);
        auVar107 = vperm2f128_avx(auVar7,auVar108,0x31);
        *pauVar39 = auVar118;
        pauVar39[1] = auVar75;
        pauVar39[2] = auVar76;
        pauVar39[3] = auVar77;
        pauVar39[4] = auVar78;
        pauVar39[5] = auVar79;
        pauVar39[6] = auVar80;
        pauVar39[7] = auVar81;
        pauVar39[8] = auVar112;
        pauVar39[9] = auVar8;
        pauVar39[10] = auVar6;
        pauVar39[0xb] = auVar9;
        pauVar39[0xc] = auVar82;
        pauVar39[0xd] = auVar109;
        pauVar39[0xe] = auVar71;
        pauVar39[0xf] = auVar107;
        pauVar54 = pauVar54 + 8;
        pauVar39 = (undefined1 (*) [32])(*pauVar39 + lVar20);
        iVar24 = iVar24 + 0x10;
        pauVar44 = (undefined1 (*) [32])(*pauVar44 + lVar20);
      }
      for (; iVar46 + 0xb < max_jj; iVar46 = iVar46 + 0xc) {
        auVar71 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                               *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar8 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                               *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar107 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar110 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[2],
                                 *(undefined1 (*) [32])(pauVar54[2] + 0x20));
        auVar9 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[2],
                               *(undefined1 (*) [32])(pauVar54[2] + 0x20));
        auVar113 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[3],
                                 *(undefined1 (*) [32])(pauVar54[3] + 0x20));
        auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[3],
                               *(undefined1 (*) [32])(pauVar54[3] + 0x20));
        auVar116 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[4],
                                 *(undefined1 (*) [32])(pauVar54[4] + 0x20));
        auVar109 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[4],
                                 *(undefined1 (*) [32])(pauVar54[4] + 0x20));
        auVar114 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[5],
                                 *(undefined1 (*) [32])(pauVar54[5] + 0x20));
        auVar108 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[5],
                                 *(undefined1 (*) [32])(pauVar54[5] + 0x20));
        auVar112 = vunpcklpd_avx(auVar71,auVar8);
        auVar71 = vunpckhpd_avx(auVar71,auVar8);
        auVar8 = vunpcklpd_avx(auVar6,auVar107);
        auVar6 = vunpckhpd_avx(auVar6,auVar107);
        auVar82 = vunpcklpd_avx(auVar110,auVar113);
        auVar107 = vunpckhpd_avx(auVar110,auVar113);
        auVar110 = vunpcklpd_avx(auVar9,auVar7);
        auVar9 = vunpckhpd_avx(auVar9,auVar7);
        auVar113 = vunpcklpd_avx(auVar116,auVar114);
        auVar7 = vunpckhpd_avx(auVar116,auVar114);
        auVar116 = vunpcklpd_avx(auVar109,auVar108);
        auVar109 = vunpckhpd_avx(auVar109,auVar108);
        auVar114._16_16_ = auVar82._0_16_;
        auVar114._0_16_ = auVar112._0_16_;
        auVar74._16_16_ = auVar7._0_16_;
        auVar74._0_16_ = auVar107._0_16_;
        auVar76._16_16_ = auVar110._0_16_;
        auVar76._0_16_ = auVar8._0_16_;
        auVar77._16_16_ = auVar109._0_16_;
        auVar77._0_16_ = auVar9._0_16_;
        auVar108 = vperm2f128_avx(auVar112,auVar82,0x31);
        auVar107 = vperm2f128_avx(auVar107,auVar7,0x31);
        auVar7 = vperm2f128_avx(auVar8,auVar110,0x31);
        auVar9 = vperm2f128_avx(auVar9,auVar109,0x31);
        *pauVar39 = auVar114;
        *(undefined1 (*) [16])pauVar39[1] = auVar113._0_16_;
        *(undefined1 (*) [16])pauVar39[2] = auVar71._0_16_;
        *(undefined1 (*) [32])(pauVar39[2] + 0x10) = auVar74;
        pauVar39[4] = auVar76;
        *(undefined1 (*) [16])pauVar39[5] = auVar116._0_16_;
        *(undefined1 (*) [16])pauVar39[6] = auVar6._0_16_;
        *(undefined1 (*) [32])(pauVar39[6] + 0x10) = auVar77;
        pauVar39[8] = auVar108;
        *(undefined1 (*) [16])pauVar39[9] = auVar113._16_16_;
        *(undefined1 (*) [16])pauVar39[10] = auVar71._16_16_;
        *(undefined1 (*) [32])(pauVar39[10] + 0x10) = auVar107;
        pauVar39[0xc] = auVar7;
        *(undefined1 (*) [16])pauVar39[0xd] = auVar116._16_16_;
        *(undefined1 (*) [16])pauVar39[0xe] = auVar6._16_16_;
        *(undefined1 (*) [32])(pauVar39[0xe] + 0x10) = auVar9;
        pauVar54 = pauVar54 + 6;
        pauVar39 = (undefined1 (*) [32])(*pauVar39 + lVar20);
        iVar24 = iVar24 + 0xc;
        pauVar44 = (undefined1 (*) [32])(*pauVar44 + lVar20);
      }
      for (; iVar46 + 7 < max_jj; iVar46 = iVar46 + 8) {
        auVar71 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                               *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar108 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar107 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar8 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[2],
                               *(undefined1 (*) [32])(pauVar54[2] + 0x20));
        auVar9 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[2],
                               *(undefined1 (*) [32])(pauVar54[2] + 0x20));
        auVar82 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[3],
                                *(undefined1 (*) [32])(pauVar54[3] + 0x20));
        auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[3],
                               *(undefined1 (*) [32])(pauVar54[3] + 0x20));
        auVar109 = vunpcklpd_avx(auVar71,auVar108);
        auVar71 = vunpckhpd_avx(auVar71,auVar108);
        auVar108 = vunpcklpd_avx(auVar6,auVar107);
        auVar6 = vunpckhpd_avx(auVar6,auVar107);
        auVar112 = vunpcklpd_avx(auVar8,auVar82);
        auVar107 = vunpckhpd_avx(auVar8,auVar82);
        auVar8 = vunpcklpd_avx(auVar9,auVar7);
        auVar9 = vunpckhpd_avx(auVar9,auVar7);
        auVar82._16_16_ = auVar112._0_16_;
        auVar82._0_16_ = auVar109._0_16_;
        auVar78._16_16_ = auVar107._0_16_;
        auVar78._0_16_ = auVar71._0_16_;
        auVar79._16_16_ = auVar8._0_16_;
        auVar79._0_16_ = auVar108._0_16_;
        auVar80._16_16_ = auVar9._0_16_;
        auVar80._0_16_ = auVar6._0_16_;
        auVar7 = vperm2f128_avx(auVar109,auVar112,0x31);
        auVar71 = vperm2f128_avx(auVar71,auVar107,0x31);
        auVar107 = vperm2f128_avx(auVar108,auVar8,0x31);
        auVar6 = vperm2f128_avx(auVar6,auVar9,0x31);
        *pauVar39 = auVar82;
        pauVar39[2] = auVar78;
        pauVar39[4] = auVar79;
        pauVar39[6] = auVar80;
        pauVar39[8] = auVar7;
        pauVar39[10] = auVar71;
        pauVar39[0xc] = auVar107;
        pauVar39[0xe] = auVar6;
        pauVar54 = pauVar54 + 4;
        pauVar39 = (undefined1 (*) [32])(*pauVar39 + lVar20);
        iVar24 = iVar24 + 8;
        pauVar44 = (undefined1 (*) [32])(*pauVar44 + lVar20);
      }
      for (; iVar24 < max_jj; iVar24 = iVar24 + 4) {
        auVar71 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                               *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                               *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar107 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar9 = vunpcklpd_avx(auVar71,auVar7);
        auVar71 = vunpckhpd_avx(auVar71,auVar7);
        auVar7 = vunpcklpd_avx(auVar6,auVar107);
        auVar6 = vunpckhpd_avx(auVar6,auVar107);
        *(undefined1 (*) [16])pauVar44[-0xe] = auVar9._0_16_;
        *(undefined1 (*) [16])pauVar44[-0xc] = auVar71._0_16_;
        *(undefined1 (*) [16])pauVar44[-10] = auVar7._0_16_;
        *(undefined1 (*) [16])pauVar44[-8] = auVar6._0_16_;
        *(undefined1 (*) [16])pauVar44[-6] = auVar9._16_16_;
        *(undefined1 (*) [16])pauVar44[-4] = auVar71._16_16_;
        *(undefined1 (*) [16])pauVar44[-2] = auVar7._16_16_;
        *(undefined1 (*) [16])*pauVar44 = auVar6._16_16_;
        pauVar54 = pauVar54 + 2;
        pauVar44 = (undefined1 (*) [32])(*pauVar44 + lVar20);
      }
    }
    if (iVar2 == 8) {
      pauVar39 = (undefined1 (*) [32])((long)top_blob->data + (lVar30 + uVar38) * 0x20 + lVar19 * 4)
      ;
      iVar46 = 0;
      if (uVar50 == 4) {
        auVar71 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                               *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                               *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar107 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar9 = vunpcklpd_avx(auVar71,auVar7);
        auVar71 = vunpckhpd_avx(auVar71,auVar7);
        auVar7 = vunpcklpd_avx(auVar6,auVar107);
        auVar6 = vunpckhpd_avx(auVar6,auVar107);
        *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar9._0_16_;
        *(undefined1 (*) [16])(pauVar39[1] + 0x10) = auVar71._0_16_;
        *(undefined1 (*) [16])(pauVar39[2] + 0x10) = auVar7._0_16_;
        *(undefined1 (*) [16])(pauVar39[3] + 0x10) = auVar6._0_16_;
        *(undefined1 (*) [16])(pauVar39[4] + 0x10) = auVar9._16_16_;
        *(undefined1 (*) [16])(pauVar39[5] + 0x10) = auVar71._16_16_;
        *(undefined1 (*) [16])(pauVar39[6] + 0x10) = auVar7._16_16_;
        *(undefined1 (*) [16])(pauVar39[7] + 0x10) = auVar6._16_16_;
        pauVar54 = pauVar54 + 2;
        pauVar39 = (undefined1 (*) [32])(*pauVar39 + lVar36 * 4);
        iVar46 = 4;
      }
      iVar24 = iVar46 + 3;
      pauVar44 = pauVar39 + 7;
      for (; iVar46 + 7 < max_jj; iVar46 = iVar46 + 8) {
        auVar71 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                               *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar108 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar107 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar8 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[2],
                               *(undefined1 (*) [32])(pauVar54[2] + 0x20));
        auVar9 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[2],
                               *(undefined1 (*) [32])(pauVar54[2] + 0x20));
        auVar82 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[3],
                                *(undefined1 (*) [32])(pauVar54[3] + 0x20));
        auVar7 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[3],
                               *(undefined1 (*) [32])(pauVar54[3] + 0x20));
        auVar109 = vunpcklpd_avx(auVar71,auVar108);
        auVar71 = vunpckhpd_avx(auVar71,auVar108);
        auVar108 = vunpcklpd_avx(auVar6,auVar107);
        auVar6 = vunpckhpd_avx(auVar6,auVar107);
        auVar112 = vunpcklpd_avx(auVar8,auVar82);
        auVar107 = vunpckhpd_avx(auVar8,auVar82);
        auVar8 = vunpcklpd_avx(auVar9,auVar7);
        auVar9 = vunpckhpd_avx(auVar9,auVar7);
        auVar81._16_16_ = auVar112._0_16_;
        auVar81._0_16_ = auVar109._0_16_;
        auVar111._16_16_ = auVar107._0_16_;
        auVar111._0_16_ = auVar71._0_16_;
        auVar115._16_16_ = auVar8._0_16_;
        auVar115._0_16_ = auVar108._0_16_;
        auVar117._16_16_ = auVar9._0_16_;
        auVar117._0_16_ = auVar6._0_16_;
        auVar7 = vperm2f128_avx(auVar109,auVar112,0x31);
        auVar71 = vperm2f128_avx(auVar71,auVar107,0x31);
        auVar107 = vperm2f128_avx(auVar108,auVar8,0x31);
        auVar6 = vperm2f128_avx(auVar6,auVar9,0x31);
        *pauVar39 = auVar81;
        pauVar39[1] = auVar111;
        pauVar39[2] = auVar115;
        pauVar39[3] = auVar117;
        pauVar39[4] = auVar7;
        pauVar39[5] = auVar71;
        pauVar39[6] = auVar107;
        pauVar39[7] = auVar6;
        pauVar54 = pauVar54 + 4;
        pauVar39 = (undefined1 (*) [32])(*pauVar39 + lVar1);
        iVar24 = iVar24 + 8;
        pauVar44 = (undefined1 (*) [32])(*pauVar44 + lVar1);
      }
      for (; iVar24 < max_jj; iVar24 = iVar24 + 4) {
        auVar71 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                               *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                               *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar107 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar9 = vunpcklpd_avx(auVar71,auVar7);
        auVar71 = vunpckhpd_avx(auVar71,auVar7);
        auVar7 = vunpcklpd_avx(auVar6,auVar107);
        auVar6 = vunpckhpd_avx(auVar6,auVar107);
        *(undefined1 (*) [16])pauVar44[-7] = auVar9._0_16_;
        *(undefined1 (*) [16])pauVar44[-6] = auVar71._0_16_;
        *(undefined1 (*) [16])pauVar44[-5] = auVar7._0_16_;
        *(undefined1 (*) [16])pauVar44[-4] = auVar6._0_16_;
        *(undefined1 (*) [16])pauVar44[-3] = auVar9._16_16_;
        *(undefined1 (*) [16])pauVar44[-2] = auVar71._16_16_;
        *(undefined1 (*) [16])pauVar44[-1] = auVar7._16_16_;
        *(undefined1 (*) [16])*pauVar44 = auVar6._16_16_;
        pauVar54 = pauVar54 + 2;
        pauVar44 = (undefined1 (*) [32])(*pauVar44 + lVar1);
      }
    }
    if (iVar2 == 4) {
      pauVar39 = (undefined1 (*) [32])((long)top_blob->data + local_b0);
      for (iVar46 = 3; iVar46 < max_jj; iVar46 = iVar46 + 4) {
        auVar71 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar54,
                                *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar6 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar54,
                               *(undefined1 (*) [32])(*pauVar54 + 0x20));
        auVar7 = vunpcklps_avx(*(undefined1 (*) [32])pauVar54[1],
                               *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar107 = vunpckhps_avx(*(undefined1 (*) [32])pauVar54[1],
                                 *(undefined1 (*) [32])(pauVar54[1] + 0x20));
        auVar9 = vunpcklpd_avx(auVar71,auVar7);
        auVar71 = vunpckhpd_avx(auVar71,auVar7);
        auVar7 = vunpcklpd_avx(auVar6,auVar107);
        auVar6 = vunpckhpd_avx(auVar6,auVar107);
        auVar107._16_16_ = auVar71._0_16_;
        auVar107._0_16_ = auVar9._0_16_;
        auVar108._16_16_ = auVar6._0_16_;
        auVar108._0_16_ = auVar7._0_16_;
        auVar71 = vperm2f128_avx(auVar9,auVar71,0x31);
        auVar6 = vperm2f128_avx(auVar7,auVar6,0x31);
        pauVar39[-3] = auVar107;
        pauVar39[-2] = auVar108;
        pauVar39[-1] = auVar71;
        *pauVar39 = auVar6;
        pauVar54 = pauVar54 + 2;
        pauVar39 = (undefined1 (*) [32])(*pauVar39 + lVar53);
      }
    }
    if (iVar2 == 1) {
      pauVar39 = (undefined1 (*) [32])((long)top_blob->data + lVar26);
      iVar46 = iVar29;
      while (bVar56 = iVar46 != 0, iVar46 = iVar46 + -1, bVar56) {
        *pauVar39 = *(undefined1 (*) [32])*pauVar54;
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x20);
        pauVar39 = (undefined1 (*) [32])(*pauVar39 + lVar32);
      }
    }
    lVar51 = lVar51 + 0x80;
    lVar26 = lVar26 + 0x20;
    lVar42 = lVar42 + 0x80;
    lVar48 = lVar48 + 0x20;
    lVar34 = lVar34 + 0x80;
    local_b0 = local_b0 + 0x80;
  }
  for (; (long)(uVar38 | 3) < lVar25; uVar38 = uVar38 + 4) {
    if (iVar2 == 0x10) {
      pauVar40 = (undefined1 (*) [16])((long)top_blob->data + (uVar38 + lVar30) * 0x40 + lVar18);
      if (uVar28 == 0xc) {
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar63 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                               *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar59 = vunpcklpd_avx(auVar57,auVar63);
        auVar57 = vunpckhpd_avx(auVar57,auVar63);
        auVar63 = vunpcklpd_avx(auVar4,auVar58);
        auVar4 = vunpckhpd_avx(auVar4,auVar58);
        pauVar40[3] = auVar59;
        pauVar40[7] = auVar57;
        pauVar40[0xb] = auVar63;
        pauVar40[0xf] = auVar4;
        pauVar54 = pauVar54 + 1;
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar55 * 4);
        iVar46 = 4;
      }
      else {
        if (uVar28 == 8) {
          auVar58 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                  *(undefined1 (*) [16])(*pauVar54 + 0x10));
          auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar54 + 0x30));
          auVar57 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                                  *(undefined1 (*) [16])(*pauVar54 + 0x10));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                 *(undefined1 (*) [16])(*pauVar54 + 0x30));
          if (max_jj < 5) {
            auVar63 = vunpcklpd_avx(auVar58,auVar59);
            auVar58 = vunpckhpd_avx(auVar58,auVar59);
            auVar59 = vunpcklpd_avx(auVar57,auVar4);
            auVar57 = vunpckhpd_avx(auVar57,auVar4);
            lVar33 = 0x20;
            lVar21 = 0x40;
            iVar46 = 4;
          }
          else {
            auVar66 = vunpcklpd_avx(auVar58,auVar59);
            auVar58 = vunpckhpd_avx(auVar58,auVar59);
            auVar59 = vunpcklpd_avx(auVar57,auVar4);
            auVar57 = vunpckhpd_avx(auVar57,auVar4);
            auVar4 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[1],
                                   *(undefined1 (*) [16])(pauVar54[1] + 0x10));
            auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                    *(undefined1 (*) [16])(pauVar54[1] + 0x30));
            auVar63 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[1],
                                    *(undefined1 (*) [16])(pauVar54[1] + 0x10));
            auVar3 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                   *(undefined1 (*) [16])(pauVar54[1] + 0x30));
            auVar5 = vunpcklpd_avx(auVar4,auVar60);
            auVar4 = vunpckhpd_avx(auVar4,auVar60);
            auVar60 = vunpcklpd_avx(auVar63,auVar3);
            auVar63 = vunpckhpd_avx(auVar63,auVar3);
            pauVar40[2] = auVar66;
            pauVar40[3] = auVar5;
            pauVar40[7] = auVar4;
            pauVar40[0xb] = auVar60;
            lVar21 = 0x80;
            lVar33 = 0xf0;
            iVar46 = 8;
          }
          *(undefined1 (*) [16])(*pauVar40 + lVar33) = auVar63;
          pauVar40[6] = auVar58;
          pauVar40[10] = auVar59;
          pauVar40[0xe] = auVar57;
        }
        else {
          iVar46 = 0;
          if (uVar28 != 4) goto LAB_00451284;
          auVar58 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                  *(undefined1 (*) [16])(*pauVar54 + 0x10));
          auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                  *(undefined1 (*) [16])(*pauVar54 + 0x30));
          auVar57 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                                  *(undefined1 (*) [16])(*pauVar54 + 0x10));
          auVar4 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                 *(undefined1 (*) [16])(*pauVar54 + 0x30));
          if (max_jj < 5) {
            auVar63 = vunpcklpd_avx(auVar58,auVar59);
            auVar58 = vunpckhpd_avx(auVar58,auVar59);
            auVar59 = vunpcklpd_avx(auVar57,auVar4);
            auVar57 = vunpckhpd_avx(auVar57,auVar4);
            lVar49 = 0x10;
            lVar33 = 0x50;
            lVar21 = 0x40;
            iVar46 = 4;
          }
          else {
            auVar60 = vunpcklpd_avx(auVar58,auVar59);
            auVar3 = vunpckhpd_avx(auVar58,auVar59);
            auVar59 = vunpcklpd_avx(auVar57,auVar4);
            auVar57 = vunpckhpd_avx(auVar57,auVar4);
            auVar4 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[1],
                                   *(undefined1 (*) [16])(pauVar54[1] + 0x10));
            auVar66 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                    *(undefined1 (*) [16])(pauVar54[1] + 0x30));
            auVar58 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[1],
                                    *(undefined1 (*) [16])(pauVar54[1] + 0x10));
            auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                    *(undefined1 (*) [16])(pauVar54[1] + 0x30));
            auVar61 = vunpcklpd_avx(auVar4,auVar66);
            auVar4 = vunpckhpd_avx(auVar4,auVar66);
            auVar62 = vunpcklpd_avx(auVar58,auVar63);
            auVar63 = vunpckhpd_avx(auVar58,auVar63);
            auVar66 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[2],
                                    *(undefined1 (*) [16])(pauVar54[2] + 0x10));
            auVar65 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar54[2] + 0x20),
                                    *(undefined1 (*) [16])(pauVar54[2] + 0x30));
            auVar58 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[2],
                                    *(undefined1 (*) [16])(pauVar54[2] + 0x10));
            auVar5 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[2] + 0x20),
                                   *(undefined1 (*) [16])(pauVar54[2] + 0x30));
            auVar64 = vunpcklpd_avx(auVar66,auVar65);
            auVar66 = vunpckhpd_avx(auVar66,auVar65);
            auVar65 = vunpcklpd_avx(auVar58,auVar5);
            auVar58 = vunpckhpd_avx(auVar58,auVar5);
            pauVar40[1] = auVar60;
            pauVar40[2] = auVar61;
            pauVar40[3] = auVar64;
            pauVar40[5] = auVar3;
            pauVar40[6] = auVar4;
            pauVar40[7] = auVar66;
            pauVar40[10] = auVar62;
            pauVar40[0xb] = auVar65;
            lVar21 = 0xc0;
            lVar33 = 0xf0;
            lVar49 = 0xe0;
            iVar46 = 0xc;
          }
          *(undefined1 (*) [16])(*pauVar40 + lVar49) = auVar63;
          *(undefined1 (*) [16])(*pauVar40 + lVar33) = auVar58;
          pauVar40[9] = auVar59;
          pauVar40[0xd] = auVar57;
        }
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + lVar21);
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar55 * 4);
      }
LAB_00451284:
      iVar24 = iVar46 + 3;
      pauVar45 = pauVar40 + 0xc;
      for (; iVar46 + 0xf < max_jj; iVar46 = iVar46 + 0x10) {
        auVar58 = vunpcklps_avx512vl(*(undefined1 (*) [16])*pauVar54,
                                     *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar59 = vunpcklps_avx512vl(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                     *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar57 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                                *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                               *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar60 = vunpcklpd_avx512vl(auVar58,auVar59);
        auVar61 = vunpckhpd_avx512vl(auVar58,auVar59);
        auVar62 = vunpcklpd_avx512vl(auVar57,auVar4);
        auVar57 = vunpckhpd_avx(auVar57,auVar4);
        auVar59 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[1],
                                *(undefined1 (*) [16])(pauVar54[1] + 0x10));
        auVar63 = vunpcklps_avx512vl(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                     *(undefined1 (*) [16])(pauVar54[1] + 0x30));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[1],
                               *(undefined1 (*) [16])(pauVar54[1] + 0x10));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[1] + 0x30));
        auVar64 = vunpcklpd_avx512vl(auVar59,auVar63);
        auVar65 = vunpckhpd_avx512vl(auVar59,auVar63);
        auVar3 = vunpcklpd_avx(auVar4,auVar58);
        auVar4 = vunpckhpd_avx(auVar4,auVar58);
        auVar63 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[2],
                                *(undefined1 (*) [16])(pauVar54[2] + 0x10));
        auVar66 = vunpcklps_avx512vl(*(undefined1 (*) [16])(pauVar54[2] + 0x20),
                                     *(undefined1 (*) [16])(pauVar54[2] + 0x30));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[2],
                                *(undefined1 (*) [16])(pauVar54[2] + 0x10));
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[2] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[2] + 0x30));
        auVar67 = vunpcklpd_avx512vl(auVar63,auVar66);
        auVar68 = vunpckhpd_avx512vl(auVar63,auVar66);
        auVar66 = vunpcklpd_avx(auVar58,auVar59);
        auVar58 = vunpckhpd_avx(auVar58,auVar59);
        auVar5 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[3],
                               *(undefined1 (*) [16])(pauVar54[3] + 0x10));
        auVar69 = vunpcklps_avx512vl(*(undefined1 (*) [16])(pauVar54[3] + 0x20),
                                     *(undefined1 (*) [16])(pauVar54[3] + 0x30));
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[3],
                                *(undefined1 (*) [16])(pauVar54[3] + 0x10));
        auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[3] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[3] + 0x30));
        auVar70 = vunpcklpd_avx512vl(auVar5,auVar69);
        auVar69 = vunpckhpd_avx512vl(auVar5,auVar69);
        auVar5 = vunpcklpd_avx(auVar59,auVar63);
        auVar59 = vunpckhpd_avx(auVar59,auVar63);
        *pauVar40 = auVar60;
        pauVar40[1] = auVar64;
        pauVar40[2] = auVar67;
        pauVar40[3] = auVar70;
        pauVar40[4] = auVar61;
        pauVar40[5] = auVar65;
        pauVar40[6] = auVar68;
        pauVar40[7] = auVar69;
        pauVar40[8] = auVar62;
        pauVar40[9] = auVar3;
        pauVar40[10] = auVar66;
        pauVar40[0xb] = auVar5;
        pauVar40[0xc] = auVar57;
        pauVar40[0xd] = auVar4;
        pauVar40[0xe] = auVar58;
        pauVar40[0xf] = auVar59;
        pauVar54 = pauVar54 + 4;
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar20);
        iVar24 = iVar24 + 0x10;
        pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar20);
      }
      for (; iVar46 + 0xb < max_jj; iVar46 = iVar46 + 0xc) {
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                               *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar5 = vunpcklpd_avx(auVar57,auVar59);
        auVar57 = vunpckhpd_avx(auVar57,auVar59);
        auVar60 = vunpcklpd_avx(auVar4,auVar58);
        auVar4 = vunpckhpd_avx(auVar4,auVar58);
        auVar58 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[1],
                                *(undefined1 (*) [16])(pauVar54[1] + 0x10));
        auVar3 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                               *(undefined1 (*) [16])(pauVar54[1] + 0x30));
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[1],
                                *(undefined1 (*) [16])(pauVar54[1] + 0x10));
        auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[1] + 0x30));
        auVar61 = vunpcklpd_avx(auVar58,auVar3);
        auVar58 = vunpckhpd_avx(auVar58,auVar3);
        auVar62 = vunpcklpd_avx(auVar59,auVar63);
        auVar59 = vunpckhpd_avx(auVar59,auVar63);
        auVar63 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[2],
                                *(undefined1 (*) [16])(pauVar54[2] + 0x10));
        auVar65 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar54[2] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[2] + 0x30));
        auVar3 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[2],
                               *(undefined1 (*) [16])(pauVar54[2] + 0x10));
        auVar66 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[2] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[2] + 0x30));
        auVar64 = vunpcklpd_avx(auVar63,auVar65);
        auVar63 = vunpckhpd_avx(auVar63,auVar65);
        auVar65 = vunpcklpd_avx(auVar3,auVar66);
        auVar3 = vunpckhpd_avx(auVar3,auVar66);
        *pauVar40 = auVar5;
        pauVar40[1] = auVar61;
        pauVar40[2] = auVar64;
        pauVar40[4] = auVar57;
        pauVar40[5] = auVar58;
        pauVar40[6] = auVar63;
        pauVar40[8] = auVar60;
        pauVar40[9] = auVar62;
        pauVar40[10] = auVar65;
        pauVar40[0xc] = auVar4;
        pauVar40[0xd] = auVar59;
        pauVar40[0xe] = auVar3;
        pauVar54 = pauVar54 + 3;
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar20);
        iVar24 = iVar24 + 0xc;
        pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar20);
      }
      for (; iVar46 + 7 < max_jj; iVar46 = iVar46 + 8) {
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                               *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar3 = vunpcklpd_avx(auVar57,auVar59);
        auVar57 = vunpckhpd_avx(auVar57,auVar59);
        auVar66 = vunpcklpd_avx(auVar4,auVar58);
        auVar4 = vunpckhpd_avx(auVar4,auVar58);
        auVar58 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[1],
                                *(undefined1 (*) [16])(pauVar54[1] + 0x10));
        auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[1] + 0x30));
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[1],
                                *(undefined1 (*) [16])(pauVar54[1] + 0x10));
        auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[1] + 0x30));
        auVar5 = vunpcklpd_avx(auVar58,auVar60);
        auVar58 = vunpckhpd_avx(auVar58,auVar60);
        auVar60 = vunpcklpd_avx(auVar59,auVar63);
        auVar59 = vunpckhpd_avx(auVar59,auVar63);
        *pauVar40 = auVar3;
        pauVar40[1] = auVar5;
        pauVar40[4] = auVar57;
        pauVar40[5] = auVar58;
        pauVar40[8] = auVar66;
        pauVar40[9] = auVar60;
        pauVar40[0xc] = auVar4;
        pauVar40[0xd] = auVar59;
        pauVar54 = pauVar54 + 2;
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar20);
        iVar24 = iVar24 + 8;
        pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar20);
      }
      for (; iVar24 < max_jj; iVar24 = iVar24 + 4) {
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar63 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                               *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar59 = vunpcklpd_avx(auVar57,auVar63);
        auVar57 = vunpckhpd_avx(auVar57,auVar63);
        auVar63 = vunpcklpd_avx(auVar4,auVar58);
        auVar4 = vunpckhpd_avx(auVar4,auVar58);
        pauVar45[-0xc] = auVar59;
        pauVar45[-8] = auVar57;
        pauVar45[-4] = auVar63;
        *pauVar45 = auVar4;
        pauVar54 = pauVar54 + 1;
        pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar20);
      }
    }
    if (iVar2 == 8) {
      pauVar40 = (undefined1 (*) [16])((long)top_blob->data + (lVar30 + uVar38) * 0x20 + lVar19 * 4)
      ;
      iVar46 = 0;
      if (uVar50 == 4) {
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar63 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                               *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar59 = vunpcklpd_avx(auVar57,auVar63);
        auVar57 = vunpckhpd_avx(auVar57,auVar63);
        auVar63 = vunpcklpd_avx(auVar4,auVar58);
        auVar4 = vunpckhpd_avx(auVar4,auVar58);
        pauVar40[1] = auVar59;
        pauVar40[3] = auVar57;
        pauVar40[5] = auVar63;
        pauVar40[7] = auVar4;
        pauVar54 = pauVar54 + 1;
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar36 * 4);
        iVar46 = 4;
      }
      iVar24 = iVar46 + 3;
      pauVar45 = pauVar40 + 6;
      for (; iVar46 + 7 < max_jj; iVar46 = iVar46 + 8) {
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                               *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar3 = vunpcklpd_avx(auVar57,auVar59);
        auVar57 = vunpckhpd_avx(auVar57,auVar59);
        auVar66 = vunpcklpd_avx(auVar4,auVar58);
        auVar4 = vunpckhpd_avx(auVar4,auVar58);
        auVar58 = vunpcklps_avx(*(undefined1 (*) [16])pauVar54[1],
                                *(undefined1 (*) [16])(pauVar54[1] + 0x10));
        auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[1] + 0x30));
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])pauVar54[1],
                                *(undefined1 (*) [16])(pauVar54[1] + 0x10));
        auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pauVar54[1] + 0x20),
                                *(undefined1 (*) [16])(pauVar54[1] + 0x30));
        auVar5 = vunpcklpd_avx(auVar58,auVar60);
        auVar58 = vunpckhpd_avx(auVar58,auVar60);
        auVar60 = vunpcklpd_avx(auVar59,auVar63);
        auVar59 = vunpckhpd_avx(auVar59,auVar63);
        *pauVar40 = auVar3;
        pauVar40[1] = auVar5;
        pauVar40[2] = auVar57;
        pauVar40[3] = auVar58;
        pauVar40[4] = auVar66;
        pauVar40[5] = auVar60;
        pauVar40[6] = auVar4;
        pauVar40[7] = auVar59;
        pauVar54 = pauVar54 + 2;
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar1);
        iVar24 = iVar24 + 8;
        pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar1);
      }
      for (; iVar24 < max_jj; iVar24 = iVar24 + 4) {
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar63 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                               *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar59 = vunpcklpd_avx(auVar57,auVar63);
        auVar57 = vunpckhpd_avx(auVar57,auVar63);
        auVar63 = vunpcklpd_avx(auVar4,auVar58);
        auVar4 = vunpckhpd_avx(auVar4,auVar58);
        pauVar45[-6] = auVar59;
        pauVar45[-4] = auVar57;
        pauVar45[-2] = auVar63;
        *pauVar45 = auVar4;
        pauVar54 = pauVar54 + 1;
        pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar1);
      }
    }
    if (iVar2 == 4) {
      pauVar40 = (undefined1 (*) [16])((long)top_blob->data + lVar34);
      for (iVar46 = 3; iVar46 < max_jj; iVar46 = iVar46 + 4) {
        auVar57 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar54,
                                *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar63 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar54,
                               *(undefined1 (*) [16])(*pauVar54 + 0x10));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar54 + 0x20),
                                *(undefined1 (*) [16])(*pauVar54 + 0x30));
        auVar59 = vunpcklpd_avx(auVar57,auVar63);
        auVar57 = vunpckhpd_avx(auVar57,auVar63);
        auVar63 = vunpcklpd_avx(auVar4,auVar58);
        auVar4 = vunpckhpd_avx(auVar4,auVar58);
        pauVar40[-3] = auVar59;
        pauVar40[-2] = auVar57;
        pauVar40[-1] = auVar63;
        *pauVar40 = auVar4;
        pauVar54 = pauVar54 + 1;
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar53);
      }
    }
    if (iVar2 == 1) {
      pauVar40 = (undefined1 (*) [16])((long)top_blob->data + lVar26);
      iVar46 = iVar29;
      while (bVar56 = iVar46 != 0, iVar46 = iVar46 + -1, bVar56) {
        *pauVar40 = *(undefined1 (*) [16])*pauVar54;
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x10);
        pauVar40 = (undefined1 (*) [16])(*pauVar40 + lVar32);
      }
    }
    lVar51 = lVar51 + 0x40;
    lVar26 = lVar26 + 0x10;
    lVar42 = lVar42 + 0x40;
    lVar48 = lVar48 + 0x10;
    lVar34 = lVar34 + 0x40;
  }
  for (; (long)(uVar38 | 1) < lVar25; uVar38 = uVar38 + 2) {
    if (iVar2 == 0x10) {
      puVar27 = (undefined4 *)((long)top_blob->data + (lVar30 + uVar38) * 0x40 + lVar18);
      if (uVar28 == 0xc) {
        local_f8 = 0x30;
        local_48 = 8;
        local_d8 = 0x34;
        local_50 = 0x10;
        local_c0 = 0x38;
        local_58 = 0x18;
        local_c8 = 0x3c;
        local_60 = 4;
        lVar32 = 0x1c;
        local_98 = 0x20;
        local_e8 = 4;
        lVar34 = 0x14;
        pauVar37 = pauVar54;
        uVar35 = (ulong)uVar28;
LAB_00451e79:
        *(undefined4 *)((long)puVar27 + local_f8) = *(undefined4 *)*pauVar37;
        *(undefined4 *)((long)puVar27 + local_d8) = *(undefined4 *)(*pauVar54 + local_48);
        *(undefined4 *)((long)puVar27 + local_c0) = *(undefined4 *)(*pauVar54 + local_50);
        *(undefined4 *)((long)puVar27 + local_c8) = *(undefined4 *)(*pauVar54 + local_58);
        local_d8 = 0x70;
        lVar33 = 0x74;
        lVar49 = 0x78;
        lVar52 = 0x7c;
        lVar21 = local_98;
        iVar46 = local_e8;
        local_f8 = local_60;
LAB_00451efa:
        *(undefined4 *)((long)puVar27 + local_d8) = *(undefined4 *)(*pauVar54 + local_f8);
        *(undefined4 *)((long)puVar27 + lVar33) = *(undefined4 *)(*pauVar54 + uVar35);
        *(undefined4 *)((long)puVar27 + lVar49) = *(undefined4 *)(*pauVar54 + lVar34);
        *(undefined4 *)((long)puVar27 + lVar52) = *(undefined4 *)(*pauVar54 + lVar32);
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + lVar21);
        puVar27 = puVar27 + lVar55;
      }
      else {
        if (uVar28 == 8) {
          puVar27[8] = *(undefined4 *)*pauVar54;
          puVar27[9] = *(undefined4 *)(*pauVar54 + 8);
          puVar27[10] = *(undefined4 *)(*pauVar54 + 0x10);
          puVar27[0xb] = *(undefined4 *)(*pauVar54 + 0x18);
          lVar21 = 0x20;
          local_c8 = 0x20;
          local_70 = 0x30;
          local_78 = 0x28;
          local_e0 = 0x34;
          local_80 = 0x30;
          local_88 = 0x38;
          local_90 = 0x38;
          local_40 = 0x3c;
          local_c0 = 4;
          local_48 = 0xc;
          lVar34 = 0x14;
          local_50 = 0x14;
          lVar32 = 0x1c;
          local_58 = 0x1c;
          local_60 = 0x24;
          local_68 = 0x2c;
          local_98 = 0x40;
          local_e8 = 8;
          local_f8 = 4;
          local_d8 = 0x60;
          uVar35 = 0xc;
          lVar33 = 100;
          lVar49 = 0x68;
          lVar52 = 0x6c;
          iVar46 = 4;
          if (4 < max_jj) {
LAB_00451d0b:
            *(undefined4 *)((long)puVar27 + local_70) = *(undefined4 *)(*pauVar54 + local_c8);
            *(undefined4 *)((long)puVar27 + local_e0) = *(undefined4 *)(*pauVar54 + local_78);
            *(undefined4 *)((long)puVar27 + local_88) = *(undefined4 *)(*pauVar54 + local_80);
            *(undefined4 *)((long)puVar27 + local_40) = *(undefined4 *)(*pauVar54 + local_90);
            pauVar37 = (undefined1 (*) [64])(*pauVar54 + local_c0);
            local_f8 = 0x60;
            local_d8 = 100;
            local_c0 = 0x68;
            local_c8 = 0x6c;
            uVar35 = local_68;
            lVar34 = local_e0;
            lVar32 = local_40;
            goto LAB_00451e79;
          }
          goto LAB_00451efa;
        }
        iVar46 = 0;
        if (uVar28 == 4) {
          puVar27[4] = *(undefined4 *)*pauVar54;
          puVar27[5] = *(undefined4 *)(*pauVar54 + 8);
          puVar27[6] = *(undefined4 *)(*pauVar54 + 0x10);
          puVar27[7] = *(undefined4 *)(*pauVar54 + 0x18);
          local_f8 = 4;
          local_d8 = 0x50;
          uVar35 = 0xc;
          lVar33 = 0x54;
          lVar34 = 0x14;
          lVar49 = 0x58;
          lVar32 = 0x1c;
          lVar52 = 0x5c;
          lVar21 = 0x20;
          iVar46 = 4;
          if (4 < max_jj) {
            puVar27[8] = *(undefined4 *)(*pauVar54 + 0x20);
            puVar27[9] = *(undefined4 *)(*pauVar54 + 0x28);
            puVar27[10] = *(undefined4 *)(*pauVar54 + 0x30);
            puVar27[0xb] = *(undefined4 *)(*pauVar54 + 0x38);
            puVar27[0xc] = *(undefined4 *)pauVar54[1];
            puVar27[0xd] = *(undefined4 *)(pauVar54[1] + 8);
            puVar27[0xe] = *(undefined4 *)(pauVar54[1] + 0x10);
            puVar27[0xf] = *(undefined4 *)(pauVar54[1] + 0x18);
            local_c8 = 4;
            local_70 = 0x50;
            local_78 = 0xc;
            local_e0 = 0x54;
            local_80 = 0x14;
            local_88 = 0x58;
            local_90 = 0x1c;
            local_40 = 0x5c;
            local_c0 = 0x24;
            local_48 = 0x2c;
            local_50 = 0x34;
            local_58 = 0x3c;
            local_60 = 0x44;
            local_68 = 0x4c;
            local_98 = 0x60;
            local_e8 = 0xc;
            goto LAB_00451d0b;
          }
          goto LAB_00451efa;
        }
      }
      puVar41 = puVar27 + 0x13;
      iVar24 = iVar46 + 3;
      for (; iVar46 + 0xf < max_jj; iVar46 = iVar46 + 0x10) {
        *puVar27 = *(undefined4 *)*pauVar54;
        puVar27[1] = *(undefined4 *)(*pauVar54 + 8);
        puVar27[2] = *(undefined4 *)(*pauVar54 + 0x10);
        puVar27[3] = *(undefined4 *)(*pauVar54 + 0x18);
        puVar27[4] = *(undefined4 *)(*pauVar54 + 0x20);
        puVar27[5] = *(undefined4 *)(*pauVar54 + 0x28);
        puVar27[6] = *(undefined4 *)(*pauVar54 + 0x30);
        puVar27[7] = *(undefined4 *)(*pauVar54 + 0x38);
        puVar27[8] = *(undefined4 *)pauVar54[1];
        puVar27[9] = *(undefined4 *)(pauVar54[1] + 8);
        puVar27[10] = *(undefined4 *)(pauVar54[1] + 0x10);
        puVar27[0xb] = *(undefined4 *)(pauVar54[1] + 0x18);
        puVar27[0xc] = *(undefined4 *)(pauVar54[1] + 0x20);
        puVar27[0xd] = *(undefined4 *)(pauVar54[1] + 0x28);
        puVar27[0xe] = *(undefined4 *)(pauVar54[1] + 0x30);
        puVar27[0xf] = *(undefined4 *)(pauVar54[1] + 0x38);
        puVar27[0x10] = *(undefined4 *)(*pauVar54 + 4);
        puVar27[0x11] = *(undefined4 *)(*pauVar54 + 0xc);
        puVar27[0x12] = *(undefined4 *)(*pauVar54 + 0x14);
        puVar27[0x13] = *(undefined4 *)(*pauVar54 + 0x1c);
        puVar27[0x14] = *(undefined4 *)(*pauVar54 + 0x24);
        puVar27[0x15] = *(undefined4 *)(*pauVar54 + 0x2c);
        puVar27[0x16] = *(undefined4 *)(*pauVar54 + 0x34);
        puVar27[0x17] = *(undefined4 *)(*pauVar54 + 0x3c);
        puVar27[0x18] = *(undefined4 *)(pauVar54[1] + 4);
        puVar27[0x19] = *(undefined4 *)(pauVar54[1] + 0xc);
        puVar27[0x1a] = *(undefined4 *)(pauVar54[1] + 0x14);
        puVar27[0x1b] = *(undefined4 *)(pauVar54[1] + 0x1c);
        puVar27[0x1c] = *(undefined4 *)(pauVar54[1] + 0x24);
        puVar27[0x1d] = *(undefined4 *)(pauVar54[1] + 0x2c);
        puVar27[0x1e] = *(undefined4 *)(pauVar54[1] + 0x34);
        puVar27[0x1f] = *(undefined4 *)(pauVar54[1] + 0x3c);
        pauVar54 = pauVar54 + 2;
        puVar27 = puVar27 + lVar55;
        puVar41 = puVar41 + lVar55;
        iVar24 = iVar24 + 0x10;
      }
      for (; iVar46 + 0xb < max_jj; iVar46 = iVar46 + 0xc) {
        *puVar27 = *(undefined4 *)*pauVar54;
        puVar27[1] = *(undefined4 *)(*pauVar54 + 8);
        puVar27[2] = *(undefined4 *)(*pauVar54 + 0x10);
        puVar27[3] = *(undefined4 *)(*pauVar54 + 0x18);
        puVar27[4] = *(undefined4 *)(*pauVar54 + 0x20);
        puVar27[5] = *(undefined4 *)(*pauVar54 + 0x28);
        puVar27[6] = *(undefined4 *)(*pauVar54 + 0x30);
        puVar27[7] = *(undefined4 *)(*pauVar54 + 0x38);
        puVar27[8] = *(undefined4 *)pauVar54[1];
        puVar27[9] = *(undefined4 *)(pauVar54[1] + 8);
        puVar27[10] = *(undefined4 *)(pauVar54[1] + 0x10);
        puVar27[0xb] = *(undefined4 *)(pauVar54[1] + 0x18);
        puVar27[0x10] = *(undefined4 *)(*pauVar54 + 4);
        puVar27[0x11] = *(undefined4 *)(*pauVar54 + 0xc);
        puVar27[0x12] = *(undefined4 *)(*pauVar54 + 0x14);
        puVar27[0x13] = *(undefined4 *)(*pauVar54 + 0x1c);
        puVar27[0x14] = *(undefined4 *)(*pauVar54 + 0x24);
        puVar27[0x15] = *(undefined4 *)(*pauVar54 + 0x2c);
        puVar27[0x16] = *(undefined4 *)(*pauVar54 + 0x34);
        puVar27[0x17] = *(undefined4 *)(*pauVar54 + 0x3c);
        puVar27[0x18] = *(undefined4 *)(pauVar54[1] + 4);
        puVar27[0x19] = *(undefined4 *)(pauVar54[1] + 0xc);
        puVar27[0x1a] = *(undefined4 *)(pauVar54[1] + 0x14);
        puVar27[0x1b] = *(undefined4 *)(pauVar54[1] + 0x1c);
        pauVar54 = (undefined1 (*) [64])(pauVar54[1] + 0x20);
        puVar27 = puVar27 + lVar55;
        puVar41 = puVar41 + lVar55;
        iVar24 = iVar24 + 0xc;
      }
      for (; iVar46 + 7 < max_jj; iVar46 = iVar46 + 8) {
        *puVar27 = *(undefined4 *)*pauVar54;
        puVar27[1] = *(undefined4 *)(*pauVar54 + 8);
        puVar27[2] = *(undefined4 *)(*pauVar54 + 0x10);
        puVar27[3] = *(undefined4 *)(*pauVar54 + 0x18);
        puVar27[4] = *(undefined4 *)(*pauVar54 + 0x20);
        puVar27[5] = *(undefined4 *)(*pauVar54 + 0x28);
        puVar27[6] = *(undefined4 *)(*pauVar54 + 0x30);
        puVar27[7] = *(undefined4 *)(*pauVar54 + 0x38);
        puVar27[0x10] = *(undefined4 *)(*pauVar54 + 4);
        puVar27[0x11] = *(undefined4 *)(*pauVar54 + 0xc);
        puVar27[0x12] = *(undefined4 *)(*pauVar54 + 0x14);
        puVar27[0x13] = *(undefined4 *)(*pauVar54 + 0x1c);
        puVar27[0x14] = *(undefined4 *)(*pauVar54 + 0x24);
        puVar27[0x15] = *(undefined4 *)(*pauVar54 + 0x2c);
        puVar27[0x16] = *(undefined4 *)(*pauVar54 + 0x34);
        puVar27[0x17] = *(undefined4 *)(*pauVar54 + 0x3c);
        pauVar54 = pauVar54 + 1;
        puVar27 = puVar27 + lVar55;
        puVar41 = puVar41 + lVar55;
        iVar24 = iVar24 + 8;
      }
      for (; iVar24 < max_jj; iVar24 = iVar24 + 4) {
        puVar41[-0x13] = *(undefined4 *)*pauVar54;
        puVar41[-0x12] = *(undefined4 *)(*pauVar54 + 8);
        puVar41[-0x11] = *(undefined4 *)(*pauVar54 + 0x10);
        puVar41[-0x10] = *(undefined4 *)(*pauVar54 + 0x18);
        puVar41[-3] = *(undefined4 *)(*pauVar54 + 4);
        puVar41[-2] = *(undefined4 *)(*pauVar54 + 0xc);
        puVar41[-1] = *(undefined4 *)(*pauVar54 + 0x14);
        *puVar41 = *(undefined4 *)(*pauVar54 + 0x1c);
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x20);
        puVar41 = puVar41 + lVar55;
      }
    }
    if (iVar2 == 8) {
      puVar27 = (undefined4 *)((long)top_blob->data + (lVar30 + uVar38) * 0x20 + lVar19 * 4);
      iVar46 = 0;
      if (uVar50 == 4) {
        puVar27[4] = *(undefined4 *)*pauVar54;
        puVar27[5] = *(undefined4 *)(*pauVar54 + 8);
        puVar27[6] = *(undefined4 *)(*pauVar54 + 0x10);
        puVar27[7] = *(undefined4 *)(*pauVar54 + 0x18);
        puVar27[0xc] = *(undefined4 *)(*pauVar54 + 4);
        puVar27[0xd] = *(undefined4 *)(*pauVar54 + 0xc);
        puVar27[0xe] = *(undefined4 *)(*pauVar54 + 0x14);
        puVar27[0xf] = *(undefined4 *)(*pauVar54 + 0x1c);
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x20);
        puVar27 = puVar27 + lVar36;
        iVar46 = 4;
      }
      puVar41 = puVar27 + 0xb;
      iVar24 = iVar46 + 3;
      for (; iVar46 + 7 < max_jj; iVar46 = iVar46 + 8) {
        *puVar27 = *(undefined4 *)*pauVar54;
        puVar27[1] = *(undefined4 *)(*pauVar54 + 8);
        puVar27[2] = *(undefined4 *)(*pauVar54 + 0x10);
        puVar27[3] = *(undefined4 *)(*pauVar54 + 0x18);
        puVar27[4] = *(undefined4 *)(*pauVar54 + 0x20);
        puVar27[5] = *(undefined4 *)(*pauVar54 + 0x28);
        puVar27[6] = *(undefined4 *)(*pauVar54 + 0x30);
        puVar27[7] = *(undefined4 *)(*pauVar54 + 0x38);
        puVar27[8] = *(undefined4 *)(*pauVar54 + 4);
        puVar27[9] = *(undefined4 *)(*pauVar54 + 0xc);
        puVar27[10] = *(undefined4 *)(*pauVar54 + 0x14);
        puVar27[0xb] = *(undefined4 *)(*pauVar54 + 0x1c);
        puVar27[0xc] = *(undefined4 *)(*pauVar54 + 0x24);
        puVar27[0xd] = *(undefined4 *)(*pauVar54 + 0x2c);
        puVar27[0xe] = *(undefined4 *)(*pauVar54 + 0x34);
        puVar27[0xf] = *(undefined4 *)(*pauVar54 + 0x3c);
        pauVar54 = pauVar54 + 1;
        puVar27 = puVar27 + lVar36;
        puVar41 = puVar41 + lVar36;
        iVar24 = iVar24 + 8;
      }
      for (; iVar24 < max_jj; iVar24 = iVar24 + 4) {
        puVar41[-0xb] = *(undefined4 *)*pauVar54;
        puVar41[-10] = *(undefined4 *)(*pauVar54 + 8);
        puVar41[-9] = *(undefined4 *)(*pauVar54 + 0x10);
        puVar41[-8] = *(undefined4 *)(*pauVar54 + 0x18);
        puVar41[-3] = *(undefined4 *)(*pauVar54 + 4);
        puVar41[-2] = *(undefined4 *)(*pauVar54 + 0xc);
        puVar41[-1] = *(undefined4 *)(*pauVar54 + 0x14);
        *puVar41 = *(undefined4 *)(*pauVar54 + 0x1c);
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x20);
        puVar41 = puVar41 + lVar36;
      }
    }
    if (iVar2 == 4) {
      puVar27 = (undefined4 *)((long)top_blob->data + lVar42);
      for (iVar46 = 3; iVar46 < max_jj; iVar46 = iVar46 + 4) {
        puVar27[-7] = *(undefined4 *)*pauVar54;
        puVar27[-6] = *(undefined4 *)(*pauVar54 + 8);
        puVar27[-5] = *(undefined4 *)(*pauVar54 + 0x10);
        puVar27[-4] = *(undefined4 *)(*pauVar54 + 0x18);
        puVar27[-3] = *(undefined4 *)(*pauVar54 + 4);
        puVar27[-2] = *(undefined4 *)(*pauVar54 + 0xc);
        puVar27[-1] = *(undefined4 *)(*pauVar54 + 0x14);
        *puVar27 = *(undefined4 *)(*pauVar54 + 0x1c);
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x20);
        puVar27 = puVar27 + iVar47 * 4;
      }
    }
    if (iVar2 == 1) {
      puVar27 = (undefined4 *)((long)top_blob->data + lVar48);
      iVar46 = iVar29;
      while (bVar56 = iVar46 != 0, iVar46 = iVar46 + -1, bVar56) {
        puVar27[-1] = *(undefined4 *)*pauVar54;
        *puVar27 = *(undefined4 *)(*pauVar54 + 4);
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 8);
        puVar27 = puVar27 + lVar31;
      }
    }
    lVar51 = lVar51 + 0x20;
    lVar26 = lVar26 + 8;
    lVar42 = lVar42 + 0x20;
    lVar48 = lVar48 + 8;
  }
  do {
    if (lVar25 <= (long)uVar38) {
      return;
    }
    if (iVar2 == 0x10) {
      puVar22 = (undefined8 *)((long)top_blob->data + (lVar30 + uVar38) * 0x40 + lVar18);
      puVar23 = (undefined8 *)((long)puVar22 + lVar55 * 4);
      if (uVar28 == 0xc) {
        uVar10 = *(undefined8 *)(*pauVar54 + 8);
        puVar22[6] = *(undefined8 *)*pauVar54;
        puVar22[7] = uVar10;
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x10);
        iVar47 = 4;
        puVar22 = puVar23;
      }
      else {
        if (uVar28 == 8) {
          if (max_jj < 5) {
            uVar10 = *(undefined8 *)(*pauVar54 + 8);
            puVar22[4] = *(undefined8 *)*pauVar54;
            puVar22[5] = uVar10;
LAB_00452714:
            lVar34 = 0x10;
            iVar47 = 4;
          }
          else {
            uVar10 = *(undefined8 *)(*pauVar54 + 8);
            uVar11 = *(undefined8 *)(*pauVar54 + 0x10);
            uVar12 = *(undefined8 *)(*pauVar54 + 0x18);
            puVar22[4] = *(undefined8 *)*pauVar54;
            puVar22[5] = uVar10;
            puVar22[6] = uVar11;
            puVar22[7] = uVar12;
            lVar34 = 0x20;
            iVar47 = 8;
          }
        }
        else {
          iVar47 = 0;
          if (uVar28 != 4) goto LAB_00452729;
          if (max_jj < 5) {
            uVar10 = *(undefined8 *)(*pauVar54 + 8);
            puVar22[2] = *(undefined8 *)*pauVar54;
            puVar22[3] = uVar10;
            goto LAB_00452714;
          }
          uVar12 = *(undefined8 *)(*pauVar54 + 8);
          uVar13 = *(undefined8 *)(*pauVar54 + 0x10);
          uVar14 = *(undefined8 *)(*pauVar54 + 0x18);
          uVar10 = *(undefined8 *)(*pauVar54 + 0x20);
          uVar11 = *(undefined8 *)(*pauVar54 + 0x28);
          puVar22[2] = *(undefined8 *)*pauVar54;
          puVar22[3] = uVar12;
          puVar22[4] = uVar13;
          puVar22[5] = uVar14;
          puVar22[6] = uVar10;
          puVar22[7] = uVar11;
          lVar34 = 0x30;
          iVar47 = 0xc;
        }
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + lVar34);
        puVar22 = puVar23;
      }
LAB_00452729:
      iVar46 = iVar47 + 3;
      for (; iVar47 + 0xf < max_jj; iVar47 = iVar47 + 0x10) {
        uVar10 = *(undefined8 *)(*pauVar54 + 8);
        uVar11 = *(undefined8 *)(*pauVar54 + 0x10);
        uVar12 = *(undefined8 *)(*pauVar54 + 0x18);
        uVar13 = *(undefined8 *)(*pauVar54 + 0x20);
        uVar14 = *(undefined8 *)(*pauVar54 + 0x28);
        uVar15 = *(undefined8 *)(*pauVar54 + 0x30);
        uVar16 = *(undefined8 *)(*pauVar54 + 0x38);
        *puVar22 = *(undefined8 *)*pauVar54;
        puVar22[1] = uVar10;
        puVar22[2] = uVar11;
        puVar22[3] = uVar12;
        puVar22[4] = uVar13;
        puVar22[5] = uVar14;
        puVar22[6] = uVar15;
        puVar22[7] = uVar16;
        pauVar54 = pauVar54 + 1;
        puVar22 = (undefined8 *)((long)puVar22 + lVar20);
        iVar46 = iVar46 + 0x10;
      }
      for (; iVar47 + 0xb < max_jj; iVar47 = iVar47 + 0xc) {
        uVar12 = *(undefined8 *)(*pauVar54 + 8);
        uVar13 = *(undefined8 *)(*pauVar54 + 0x10);
        uVar14 = *(undefined8 *)(*pauVar54 + 0x18);
        uVar10 = *(undefined8 *)(*pauVar54 + 0x20);
        uVar11 = *(undefined8 *)(*pauVar54 + 0x28);
        *puVar22 = *(undefined8 *)*pauVar54;
        puVar22[1] = uVar12;
        puVar22[2] = uVar13;
        puVar22[3] = uVar14;
        puVar22[4] = uVar10;
        puVar22[5] = uVar11;
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x30);
        puVar22 = (undefined8 *)((long)puVar22 + lVar20);
        iVar46 = iVar46 + 0xc;
      }
      for (; iVar47 + 7 < max_jj; iVar47 = iVar47 + 8) {
        uVar10 = *(undefined8 *)(*pauVar54 + 8);
        uVar11 = *(undefined8 *)(*pauVar54 + 0x10);
        uVar12 = *(undefined8 *)(*pauVar54 + 0x18);
        *puVar22 = *(undefined8 *)*pauVar54;
        puVar22[1] = uVar10;
        puVar22[2] = uVar11;
        puVar22[3] = uVar12;
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x20);
        puVar22 = (undefined8 *)((long)puVar22 + lVar20);
        iVar46 = iVar46 + 8;
      }
      for (; iVar46 < max_jj; iVar46 = iVar46 + 4) {
        uVar10 = *(undefined8 *)(*pauVar54 + 8);
        *puVar22 = *(undefined8 *)*pauVar54;
        puVar22[1] = uVar10;
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x10);
        puVar22 = (undefined8 *)((long)puVar22 + lVar20);
      }
    }
    if (iVar2 == 8) {
      puVar23 = (undefined8 *)((long)top_blob->data + (lVar30 + uVar38) * 0x20 + lVar19 * 4);
      iVar47 = 0;
      if (uVar50 == 4) {
        *(undefined4 *)(puVar23 + 2) = *(undefined4 *)*pauVar54;
        *(undefined4 *)((long)puVar23 + 0x14) = *(undefined4 *)(*pauVar54 + 4);
        *(undefined4 *)(puVar23 + 3) = *(undefined4 *)(*pauVar54 + 8);
        *(undefined4 *)((long)puVar23 + 0x1c) = *(undefined4 *)(*pauVar54 + 0xc);
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x10);
        puVar23 = (undefined8 *)((long)puVar23 + lVar36 * 4);
        iVar47 = 4;
      }
      puVar27 = (undefined4 *)((long)puVar23 + 0xc);
      iVar46 = iVar47 + 3;
      for (; iVar47 + 7 < max_jj; iVar47 = iVar47 + 8) {
        uVar10 = *(undefined8 *)(*pauVar54 + 8);
        uVar11 = *(undefined8 *)(*pauVar54 + 0x10);
        uVar12 = *(undefined8 *)(*pauVar54 + 0x18);
        *puVar23 = *(undefined8 *)*pauVar54;
        puVar23[1] = uVar10;
        puVar23[2] = uVar11;
        puVar23[3] = uVar12;
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x20);
        puVar23 = (undefined8 *)((long)puVar23 + lVar1);
        puVar27 = puVar27 + lVar36;
        iVar46 = iVar46 + 8;
      }
      for (; iVar46 < max_jj; iVar46 = iVar46 + 4) {
        puVar27[-3] = *(undefined4 *)*pauVar54;
        puVar27[-2] = *(undefined4 *)(*pauVar54 + 4);
        puVar27[-1] = *(undefined4 *)(*pauVar54 + 8);
        *puVar27 = *(undefined4 *)(*pauVar54 + 0xc);
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x10);
        puVar27 = puVar27 + lVar36;
      }
    }
    if (iVar2 == 4) {
      puVar23 = (undefined8 *)((long)top_blob->data + lVar51);
      for (iVar47 = 3; iVar47 < max_jj; iVar47 = iVar47 + 4) {
        uVar10 = *(undefined8 *)(*pauVar54 + 8);
        *puVar23 = *(undefined8 *)*pauVar54;
        puVar23[1] = uVar10;
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 0x10);
        puVar23 = (undefined8 *)((long)puVar23 + lVar53);
      }
    }
    if (iVar2 == 1) {
      puVar27 = (undefined4 *)((long)top_blob->data + lVar26);
      iVar47 = iVar29;
      while (bVar56 = iVar47 != 0, iVar47 = iVar47 + -1, bVar56) {
        *puVar27 = *(undefined4 *)*pauVar54;
        pauVar54 = (undefined1 (*) [64])(*pauVar54 + 4);
        puVar27 = puVar27 + lVar31;
      }
    }
    uVar38 = uVar38 + 1;
    lVar51 = lVar51 + 0x10;
    lVar26 = lVar26 + 4;
  } while( true );
}

Assistant:

static void transpose_unpack_output_tile(const Mat& topT, Mat& top_blob, int i, int max_ii, int j, int max_jj)
{
    const int out_elempack = top_blob.elempack;
    const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;

    const float* pp = topT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                    __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                    __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                    __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                    __m512 _r8 = _mm512_load_ps(pp + 16 * 8);
                    __m512 _r9 = _mm512_load_ps(pp + 16 * 9);
                    __m512 _ra = _mm512_load_ps(pp + 16 * 10);
                    __m512 _rb = _mm512_load_ps(pp + 16 * 11);
                    transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                    _mm256_storeu_ps(p0 + 4, _mm512_extractf32x8_ps(_r0, 0));
                    _mm_store_ps(p0 + 4 + 8, _mm512_extractf32x4_ps(_r0, 2));
                    _mm_store_ps(p0 + 16 + 4, _mm512_extractf32x4_ps(_r0, 3));
                    _mm256_store_ps(p0 + 16 + 4 + 4, _mm512_extractf32x8_ps(_r1, 0));
                    _mm256_storeu_ps(p0 + 16 * 2 + 4, _mm512_extractf32x8_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 2 + 4 + 8, _mm512_extractf32x4_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm512_extractf32x4_ps(_r2, 1));
                    _mm256_store_ps(p0 + 16 * 3 + 4 + 4, _mm512_extractf32x8_ps(_r2, 1));
                    _mm256_storeu_ps(p0 + 16 * 4 + 4, _mm512_extractf32x8_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 4 + 4 + 8, _mm512_extractf32x4_ps(_r3, 2));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm512_extractf32x4_ps(_r3, 3));
                    _mm256_store_ps(p0 + 16 * 5 + 4 + 4, _mm512_extractf32x8_ps(_r4, 0));
                    _mm256_storeu_ps(p0 + 16 * 6 + 4, _mm512_extractf32x8_ps(_r4, 1));
                    _mm_store_ps(p0 + 16 * 6 + 4 + 8, _mm512_extractf32x4_ps(_r5, 0));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm512_extractf32x4_ps(_r5, 1));
                    _mm256_store_ps(p0 + 16 * 7 + 4 + 4, _mm512_extractf32x8_ps(_r5, 1));
                    _mm256_storeu_ps(p0 + 16 * 8 + 4, _mm512_extractf32x8_ps(_r6, 0));
                    _mm_store_ps(p0 + 16 * 8 + 4 + 8, _mm512_extractf32x4_ps(_r6, 2));
                    _mm_store_ps(p0 + 16 * 9 + 4, _mm512_extractf32x4_ps(_r6, 3));
                    _mm256_store_ps(p0 + 16 * 9 + 4 + 4, _mm512_extractf32x8_ps(_r7, 0));
                    _mm256_storeu_ps(p0 + 16 * 10 + 4, _mm512_extractf32x8_ps(_r7, 1));
                    _mm_store_ps(p0 + 16 * 10 + 4 + 8, _mm512_extractf32x4_ps(_r8, 0));
                    _mm_store_ps(p0 + 16 * 11 + 4, _mm512_extractf32x4_ps(_r8, 1));
                    _mm256_store_ps(p0 + 16 * 11 + 4 + 4, _mm512_extractf32x8_ps(_r8, 1));
                    _mm256_storeu_ps(p0 + 16 * 12 + 4, _mm512_extractf32x8_ps(_r9, 0));
                    _mm_store_ps(p0 + 16 * 12 + 4 + 8, _mm512_extractf32x4_ps(_r9, 2));
                    _mm_store_ps(p0 + 16 * 13 + 4, _mm512_extractf32x4_ps(_r9, 3));
                    _mm256_store_ps(p0 + 16 * 13 + 4 + 4, _mm512_extractf32x8_ps(_ra, 0));
                    _mm256_storeu_ps(p0 + 16 * 14 + 4, _mm512_extractf32x8_ps(_ra, 1));
                    _mm_store_ps(p0 + 16 * 14 + 4 + 8, _mm512_extractf32x4_ps(_rb, 0));
                    _mm_store_ps(p0 + 16 * 15 + 4, _mm512_extractf32x4_ps(_rb, 1));
                    _mm256_store_ps(p0 + 16 * 15 + 4 + 4, _mm512_extractf32x8_ps(_rb, 1));
                    pp += 192;
                    jj += 12;
                }
                else
                {
                    transpose16x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 4, _mm512_extractf32x4_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 4, _mm512_extractf32x4_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 4, _mm512_extractf32x4_ps(_r0, 2));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm512_extractf32x4_ps(_r0, 3));
                    _mm_store_ps(p0 + 16 * 4 + 4, _mm512_extractf32x4_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm512_extractf32x4_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 6 + 4, _mm512_extractf32x4_ps(_r1, 2));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm512_extractf32x4_ps(_r1, 3));
                    _mm_store_ps(p0 + 16 * 8 + 4, _mm512_extractf32x4_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 9 + 4, _mm512_extractf32x4_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 10 + 4, _mm512_extractf32x4_ps(_r2, 2));
                    _mm_store_ps(p0 + 16 * 11 + 4, _mm512_extractf32x4_ps(_r2, 3));
                    _mm_store_ps(p0 + 16 * 12 + 4, _mm512_extractf32x4_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 13 + 4, _mm512_extractf32x4_ps(_r3, 1));
                    _mm_store_ps(p0 + 16 * 14 + 4, _mm512_extractf32x4_ps(_r3, 2));
                    _mm_store_ps(p0 + 16 * 15 + 4, _mm512_extractf32x4_ps(_r3, 3));
                    pp += 64;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                if (max_jj > 4)
                {
                    __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                    __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                    __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                    __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                    transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                    _mm256_store_ps(p0 + 8, _mm512_extractf32x8_ps(_r0, 0));
                    _mm256_store_ps(p0 + 16 + 8, _mm512_extractf32x8_ps(_r0, 1));
                    _mm256_store_ps(p0 + 16 * 2 + 8, _mm512_extractf32x8_ps(_r1, 0));
                    _mm256_store_ps(p0 + 16 * 3 + 8, _mm512_extractf32x8_ps(_r1, 1));
                    _mm256_store_ps(p0 + 16 * 4 + 8, _mm512_extractf32x8_ps(_r2, 0));
                    _mm256_store_ps(p0 + 16 * 5 + 8, _mm512_extractf32x8_ps(_r2, 1));
                    _mm256_store_ps(p0 + 16 * 6 + 8, _mm512_extractf32x8_ps(_r3, 0));
                    _mm256_store_ps(p0 + 16 * 7 + 8, _mm512_extractf32x8_ps(_r3, 1));
                    _mm256_store_ps(p0 + 16 * 8 + 8, _mm512_extractf32x8_ps(_r4, 0));
                    _mm256_store_ps(p0 + 16 * 9 + 8, _mm512_extractf32x8_ps(_r4, 1));
                    _mm256_store_ps(p0 + 16 * 10 + 8, _mm512_extractf32x8_ps(_r5, 0));
                    _mm256_store_ps(p0 + 16 * 11 + 8, _mm512_extractf32x8_ps(_r5, 1));
                    _mm256_store_ps(p0 + 16 * 12 + 8, _mm512_extractf32x8_ps(_r6, 0));
                    _mm256_store_ps(p0 + 16 * 13 + 8, _mm512_extractf32x8_ps(_r6, 1));
                    _mm256_store_ps(p0 + 16 * 14 + 8, _mm512_extractf32x8_ps(_r7, 0));
                    _mm256_store_ps(p0 + 16 * 15 + 8, _mm512_extractf32x8_ps(_r7, 1));
                    pp += 128;
                    jj += 8;
                }
                else
                {
                    transpose16x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 8, _mm512_extractf32x4_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 8, _mm512_extractf32x4_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 8, _mm512_extractf32x4_ps(_r0, 2));
                    _mm_store_ps(p0 + 16 * 3 + 8, _mm512_extractf32x4_ps(_r0, 3));
                    _mm_store_ps(p0 + 16 * 4 + 8, _mm512_extractf32x4_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 5 + 8, _mm512_extractf32x4_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 6 + 8, _mm512_extractf32x4_ps(_r1, 2));
                    _mm_store_ps(p0 + 16 * 7 + 8, _mm512_extractf32x4_ps(_r1, 3));
                    _mm_store_ps(p0 + 16 * 8 + 8, _mm512_extractf32x4_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 9 + 8, _mm512_extractf32x4_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 10 + 8, _mm512_extractf32x4_ps(_r2, 2));
                    _mm_store_ps(p0 + 16 * 11 + 8, _mm512_extractf32x4_ps(_r2, 3));
                    _mm_store_ps(p0 + 16 * 12 + 8, _mm512_extractf32x4_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 13 + 8, _mm512_extractf32x4_ps(_r3, 1));
                    _mm_store_ps(p0 + 16 * 14 + 8, _mm512_extractf32x4_ps(_r3, 2));
                    _mm_store_ps(p0 + 16 * 15 + 8, _mm512_extractf32x4_ps(_r3, 3));
                    pp += 64;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 12, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 16 + 12, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2 + 12, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 16 * 3 + 12, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 16 * 4 + 12, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 5 + 12, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 6 + 12, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 16 * 7 + 12, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 16 * 8 + 12, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 9 + 12, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 10 + 12, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 16 * 11 + 12, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 16 * 12 + 12, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 13 + 12, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 16 * 14 + 12, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 16 * 15 + 12, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                __m512 _r8 = _mm512_load_ps(pp + 16 * 8);
                __m512 _r9 = _mm512_load_ps(pp + 16 * 9);
                __m512 _ra = _mm512_load_ps(pp + 16 * 10);
                __m512 _rb = _mm512_load_ps(pp + 16 * 11);
                __m512 _rc = _mm512_load_ps(pp + 16 * 12);
                __m512 _rd = _mm512_load_ps(pp + 16 * 13);
                __m512 _re = _mm512_load_ps(pp + 16 * 14);
                __m512 _rf = _mm512_load_ps(pp + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(p0, _r0);
                _mm512_store_ps(p0 + 16, _r1);
                _mm512_store_ps(p0 + 16 * 2, _r2);
                _mm512_store_ps(p0 + 16 * 3, _r3);
                _mm512_store_ps(p0 + 16 * 4, _r4);
                _mm512_store_ps(p0 + 16 * 5, _r5);
                _mm512_store_ps(p0 + 16 * 6, _r6);
                _mm512_store_ps(p0 + 16 * 7, _r7);
                _mm512_store_ps(p0 + 16 * 8, _r8);
                _mm512_store_ps(p0 + 16 * 9, _r9);
                _mm512_store_ps(p0 + 16 * 10, _ra);
                _mm512_store_ps(p0 + 16 * 11, _rb);
                _mm512_store_ps(p0 + 16 * 12, _rc);
                _mm512_store_ps(p0 + 16 * 13, _rd);
                _mm512_store_ps(p0 + 16 * 14, _re);
                _mm512_store_ps(p0 + 16 * 15, _rf);
                pp += 256;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                __m512 _r8 = _mm512_load_ps(pp + 16 * 8);
                __m512 _r9 = _mm512_load_ps(pp + 16 * 9);
                __m512 _ra = _mm512_load_ps(pp + 16 * 10);
                __m512 _rb = _mm512_load_ps(pp + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(p0, _mm512_extractf32x8_ps(_r0, 0));
                _mm_store_ps(p0 + 8, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 16, _mm512_extractf32x4_ps(_r0, 3));
                _mm256_storeu_ps(p0 + 16 + 4, _mm512_extractf32x8_ps(_r1, 0));
                _mm256_store_ps(p0 + 16 * 2, _mm512_extractf32x8_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 2 + 8, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 3, _mm512_extractf32x4_ps(_r2, 1));
                _mm256_storeu_ps(p0 + 16 * 3 + 4, _mm512_extractf32x8_ps(_r2, 1));
                _mm256_store_ps(p0 + 16 * 4, _mm512_extractf32x8_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 4 + 8, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 16 * 5, _mm512_extractf32x4_ps(_r3, 3));
                _mm256_storeu_ps(p0 + 16 * 5 + 4, _mm512_extractf32x8_ps(_r4, 0));
                _mm256_store_ps(p0 + 16 * 6, _mm512_extractf32x8_ps(_r4, 1));
                _mm_store_ps(p0 + 16 * 6 + 8, _mm512_extractf32x4_ps(_r5, 0));
                _mm_store_ps(p0 + 16 * 7, _mm512_extractf32x4_ps(_r5, 1));
                _mm256_storeu_ps(p0 + 16 * 7 + 4, _mm512_extractf32x8_ps(_r5, 1));
                _mm256_store_ps(p0 + 16 * 8, _mm512_extractf32x8_ps(_r6, 0));
                _mm_store_ps(p0 + 16 * 8 + 8, _mm512_extractf32x4_ps(_r6, 2));
                _mm_store_ps(p0 + 16 * 9, _mm512_extractf32x4_ps(_r6, 3));
                _mm256_storeu_ps(p0 + 16 * 9 + 4, _mm512_extractf32x8_ps(_r7, 0));
                _mm256_store_ps(p0 + 16 * 10, _mm512_extractf32x8_ps(_r7, 1));
                _mm_store_ps(p0 + 16 * 10 + 8, _mm512_extractf32x4_ps(_r8, 0));
                _mm_store_ps(p0 + 16 * 11, _mm512_extractf32x4_ps(_r8, 1));
                _mm256_storeu_ps(p0 + 16 * 11 + 4, _mm512_extractf32x8_ps(_r8, 1));
                _mm256_store_ps(p0 + 16 * 12, _mm512_extractf32x8_ps(_r9, 0));
                _mm_store_ps(p0 + 16 * 12 + 8, _mm512_extractf32x4_ps(_r9, 2));
                _mm_store_ps(p0 + 16 * 13, _mm512_extractf32x4_ps(_r9, 3));
                _mm256_storeu_ps(p0 + 16 * 13 + 4, _mm512_extractf32x8_ps(_ra, 0));
                _mm256_store_ps(p0 + 16 * 14, _mm512_extractf32x8_ps(_ra, 1));
                _mm_store_ps(p0 + 16 * 14 + 8, _mm512_extractf32x4_ps(_rb, 0));
                _mm_store_ps(p0 + 16 * 15, _mm512_extractf32x4_ps(_rb, 1));
                _mm256_storeu_ps(p0 + 16 * 15 + 4, _mm512_extractf32x8_ps(_rb, 1));
                pp += 192;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(p0, _mm512_extractf32x8_ps(_r0, 0));
                _mm256_store_ps(p0 + 16, _mm512_extractf32x8_ps(_r0, 1));
                _mm256_store_ps(p0 + 16 * 2, _mm512_extractf32x8_ps(_r1, 0));
                _mm256_store_ps(p0 + 16 * 3, _mm512_extractf32x8_ps(_r1, 1));
                _mm256_store_ps(p0 + 16 * 4, _mm512_extractf32x8_ps(_r2, 0));
                _mm256_store_ps(p0 + 16 * 5, _mm512_extractf32x8_ps(_r2, 1));
                _mm256_store_ps(p0 + 16 * 6, _mm512_extractf32x8_ps(_r3, 0));
                _mm256_store_ps(p0 + 16 * 7, _mm512_extractf32x8_ps(_r3, 1));
                _mm256_store_ps(p0 + 16 * 8, _mm512_extractf32x8_ps(_r4, 0));
                _mm256_store_ps(p0 + 16 * 9, _mm512_extractf32x8_ps(_r4, 1));
                _mm256_store_ps(p0 + 16 * 10, _mm512_extractf32x8_ps(_r5, 0));
                _mm256_store_ps(p0 + 16 * 11, _mm512_extractf32x8_ps(_r5, 1));
                _mm256_store_ps(p0 + 16 * 12, _mm512_extractf32x8_ps(_r6, 0));
                _mm256_store_ps(p0 + 16 * 13, _mm512_extractf32x8_ps(_r6, 1));
                _mm256_store_ps(p0 + 16 * 14, _mm512_extractf32x8_ps(_r7, 0));
                _mm256_store_ps(p0 + 16 * 15, _mm512_extractf32x8_ps(_r7, 1));
                pp += 128;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 16, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 16 * 3, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 16 * 4, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 5, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 6, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 16 * 7, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 16 * 8, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 9, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 10, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 16 * 11, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 16 * 12, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 13, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 16 * 14, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 16 * 15, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 16;
            }
        }
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 4, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 8 + 4, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2 + 4, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 8 * 3 + 4, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 8 * 4 + 4, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 5 + 4, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 6 + 4, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 8 * 7 + 4, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 8 * 8 + 4, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 9 + 4, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 10 + 4, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 8 * 11 + 4, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 8 * 12 + 4, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 13 + 4, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 8 * 14 + 4, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 8 * 15 + 4, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_storeu_ps(p0, _r0);
                _mm512_storeu_ps(p0 + 16, _r1);
                _mm512_storeu_ps(p0 + 16 * 2, _r2);
                _mm512_storeu_ps(p0 + 16 * 3, _r3);
                _mm512_storeu_ps(p0 + 16 * 4, _r4);
                _mm512_storeu_ps(p0 + 16 * 5, _r5);
                _mm512_storeu_ps(p0 + 16 * 6, _r6);
                _mm512_storeu_ps(p0 + 16 * 7, _r7);
                pp += 128;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 8, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 8 * 3, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 8 * 4, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 5, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 6, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 8 * 7, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 8 * 8, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 9, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 10, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 8 * 11, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 8 * 12, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 13, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 8 * 14, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 8 * 15, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 8;
            }
        }
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_storeu_ps(p0, _r0);
                _mm512_storeu_ps(p0 + 16, _r1);
                _mm512_storeu_ps(p0 + 16 * 2, _r2);
                _mm512_storeu_ps(p0 + 16 * 3, _r3);
                pp += 64;
                p0 += out_hstep * 4;
            }
        }
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                _mm512_storeu_ps(p0, _r0);
                pp += 16;
                p0 += out_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                    __m256 _r8 = _mm256_load_ps(pp + 8 * 8);
                    __m256 _r9 = _mm256_load_ps(pp + 8 * 9);
                    __m256 _ra = _mm256_load_ps(pp + 8 * 10);
                    __m256 _rb = _mm256_load_ps(pp + 8 * 11);
                    transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                    _mm256_storeu_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 12, _mm256_extractf128_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 + 4, _mm256_extractf128_ps(_r1, 1));
                    _mm256_store_ps(p0 + 16 + 8, _r2);
                    _mm256_storeu_ps(p0 + 16 * 2 + 4, _r3);
                    _mm_store_ps(p0 + 16 * 2 + 12, _mm256_extractf128_ps(_r4, 0));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm256_extractf128_ps(_r4, 1));
                    _mm256_store_ps(p0 + 16 * 3 + 8, _r5);
                    _mm256_storeu_ps(p0 + 16 * 4 + 4, _r6);
                    _mm_store_ps(p0 + 16 * 4 + 12, _mm256_extractf128_ps(_r7, 0));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm256_extractf128_ps(_r7, 1));
                    _mm256_store_ps(p0 + 16 * 5 + 8, _r8);
                    _mm256_storeu_ps(p0 + 16 * 6 + 4, _r9);
                    _mm_store_ps(p0 + 16 * 6 + 12, _mm256_extractf128_ps(_ra, 0));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm256_extractf128_ps(_ra, 1));
                    _mm256_store_ps(p0 + 16 * 7 + 8, _rb);
                    pp += 96;
                    jj += 12;
                }
                else
                {
                    transpose8x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 4, _mm256_extractf128_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 4, _mm256_extractf128_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 4, _mm256_extractf128_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm256_extractf128_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 4 + 4, _mm256_extractf128_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm256_extractf128_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 6 + 4, _mm256_extractf128_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm256_extractf128_ps(_r3, 1));
                    pp += 32;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                if (max_jj > 4)
                {
                    __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                    transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                    _mm256_store_ps(p0 + 8, _r0);
                    _mm256_store_ps(p0 + 16 + 8, _r1);
                    _mm256_store_ps(p0 + 16 * 2 + 8, _r2);
                    _mm256_store_ps(p0 + 16 * 3 + 8, _r3);
                    _mm256_store_ps(p0 + 16 * 4 + 8, _r4);
                    _mm256_store_ps(p0 + 16 * 5 + 8, _r5);
                    _mm256_store_ps(p0 + 16 * 6 + 8, _r6);
                    _mm256_store_ps(p0 + 16 * 7 + 8, _r7);
                    pp += 64;
                    jj += 8;
                }
                else
                {
                    transpose8x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 8, _mm256_extractf128_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 8, _mm256_extractf128_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 8, _mm256_extractf128_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 3 + 8, _mm256_extractf128_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 4 + 8, _mm256_extractf128_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 5 + 8, _mm256_extractf128_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 6 + 8, _mm256_extractf128_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 7 + 8, _mm256_extractf128_ps(_r3, 1));
                    pp += 32;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 12, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 16 + 12, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2 + 12, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 3 + 12, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 4 + 12, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 5 + 12, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 6 + 12, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 7 + 12, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                __m256 _r8 = _mm256_load_ps(pp + 8 * 8);
                __m256 _r9 = _mm256_load_ps(pp + 8 * 9);
                __m256 _ra = _mm256_load_ps(pp + 8 * 10);
                __m256 _rb = _mm256_load_ps(pp + 8 * 11);
                __m256 _rc = _mm256_load_ps(pp + 8 * 12);
                __m256 _rd = _mm256_load_ps(pp + 8 * 13);
                __m256 _re = _mm256_load_ps(pp + 8 * 14);
                __m256 _rf = _mm256_load_ps(pp + 8 * 15);
                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm256_store_ps(p0, _r0);
                _mm256_store_ps(p0 + 8, _r1);
                _mm256_store_ps(p0 + 8 * 2, _r2);
                _mm256_store_ps(p0 + 8 * 3, _r3);
                _mm256_store_ps(p0 + 8 * 4, _r4);
                _mm256_store_ps(p0 + 8 * 5, _r5);
                _mm256_store_ps(p0 + 8 * 6, _r6);
                _mm256_store_ps(p0 + 8 * 7, _r7);
                _mm256_store_ps(p0 + 8 * 8, _r8);
                _mm256_store_ps(p0 + 8 * 9, _r9);
                _mm256_store_ps(p0 + 8 * 10, _ra);
                _mm256_store_ps(p0 + 8 * 11, _rb);
                _mm256_store_ps(p0 + 8 * 12, _rc);
                _mm256_store_ps(p0 + 8 * 13, _rd);
                _mm256_store_ps(p0 + 8 * 14, _re);
                _mm256_store_ps(p0 + 8 * 15, _rf);
                pp += 128;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                __m256 _r8 = _mm256_load_ps(pp + 8 * 8);
                __m256 _r9 = _mm256_load_ps(pp + 8 * 9);
                __m256 _ra = _mm256_load_ps(pp + 8 * 10);
                __m256 _rb = _mm256_load_ps(pp + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(p0, _r0);
                _mm_store_ps(p0 + 8, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 16, _mm256_extractf128_ps(_r1, 1));
                _mm256_storeu_ps(p0 + 16 + 4, _r2);
                _mm256_store_ps(p0 + 16 * 2, _r3);
                _mm_store_ps(p0 + 16 * 2 + 8, _mm256_extractf128_ps(_r4, 0));
                _mm_store_ps(p0 + 16 * 3, _mm256_extractf128_ps(_r4, 1));
                _mm256_storeu_ps(p0 + 16 * 3 + 4, _r5);
                _mm256_store_ps(p0 + 16 * 4, _r6);
                _mm_store_ps(p0 + 16 * 4 + 8, _mm256_extractf128_ps(_r7, 0));
                _mm_store_ps(p0 + 16 * 5, _mm256_extractf128_ps(_r7, 1));
                _mm256_storeu_ps(p0 + 16 * 5 + 4, _r8);
                _mm256_store_ps(p0 + 16 * 6, _r9);
                _mm_store_ps(p0 + 16 * 6 + 8, _mm256_extractf128_ps(_ra, 0));
                _mm_store_ps(p0 + 16 * 7, _mm256_extractf128_ps(_ra, 1));
                _mm256_storeu_ps(p0 + 16 * 7 + 4, _rb);
                pp += 96;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(p0, _r0);
                _mm256_store_ps(p0 + 16, _r1);
                _mm256_store_ps(p0 + 16 * 2, _r2);
                _mm256_store_ps(p0 + 16 * 3, _r3);
                _mm256_store_ps(p0 + 16 * 4, _r4);
                _mm256_store_ps(p0 + 16 * 5, _r5);
                _mm256_store_ps(p0 + 16 * 6, _r6);
                _mm256_store_ps(p0 + 16 * 7, _r7);
                pp += 64;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 16, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 3, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 4, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 5, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 6, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 7, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 4, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 8 + 4, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2 + 4, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 3 + 4, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 4 + 4, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 5 + 4, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 6 + 4, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 7 + 4, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(p0, _r0);
                _mm256_storeu_ps(p0 + 8, _r1);
                _mm256_storeu_ps(p0 + 8 * 2, _r2);
                _mm256_storeu_ps(p0 + 8 * 3, _r3);
                _mm256_storeu_ps(p0 + 8 * 4, _r4);
                _mm256_storeu_ps(p0 + 8 * 5, _r5);
                _mm256_storeu_ps(p0 + 8 * 6, _r6);
                _mm256_storeu_ps(p0 + 8 * 7, _r7);
                pp += 64;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 8, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 3, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 4, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 5, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 6, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 7, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 8;
            }
        }
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(p0, _r0);
                _mm256_storeu_ps(p0 + 8, _r1);
                _mm256_storeu_ps(p0 + 8 * 2, _r2);
                _mm256_storeu_ps(p0 + 8 * 3, _r3);
                pp += 32;
                p0 += out_hstep * 4;
            }
        }
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                _mm256_storeu_ps(p0, _r0);
                pp += 8;
                p0 += out_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                    __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                    __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                    __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                    __m128 _r8 = _mm_load_ps(pp + 4 * 8);
                    __m128 _r9 = _mm_load_ps(pp + 4 * 9);
                    __m128 _ra = _mm_load_ps(pp + 4 * 10);
                    __m128 _rb = _mm_load_ps(pp + 4 * 11);
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                    _mm_store_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 4 + 4, _r4);
                    _mm_store_ps(p0 + 4 + 8, _r8);
                    _mm_store_ps(p0 + 16 + 4, _r1);
                    _mm_store_ps(p0 + 16 + 4 + 4, _r5);
                    _mm_store_ps(p0 + 16 + 4 + 8, _r9);
                    _mm_store_ps(p0 + 16 * 2 + 4, _r2);
                    _mm_store_ps(p0 + 16 * 2 + 4 + 4, _r6);
                    _mm_store_ps(p0 + 16 * 2 + 4 + 8, _ra);
                    _mm_store_ps(p0 + 16 * 3 + 4, _r3);
                    _mm_store_ps(p0 + 16 * 3 + 4 + 4, _r7);
                    _mm_store_ps(p0 + 16 * 3 + 4 + 8, _rb);
                    pp += 48;
                    jj += 12;
                }
                else
                {
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 16 + 4, _r1);
                    _mm_store_ps(p0 + 16 * 2 + 4, _r2);
                    _mm_store_ps(p0 + 16 * 3 + 4, _r3);
                    pp += 16;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                if (max_jj > 4)
                {
                    __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                    __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                    __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                    __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _mm_store_ps(p0 + 8, _r0);
                    _mm_store_ps(p0 + 8 + 4, _r4);
                    _mm_store_ps(p0 + 16 + 8, _r1);
                    _mm_store_ps(p0 + 16 + 8 + 4, _r5);
                    _mm_store_ps(p0 + 16 * 2 + 8, _r2);
                    _mm_store_ps(p0 + 16 * 2 + 8 + 4, _r6);
                    _mm_store_ps(p0 + 16 * 3 + 8, _r3);
                    _mm_store_ps(p0 + 16 * 3 + 8 + 4, _r7);
                    pp += 32;
                    jj += 8;
                }
                else
                {
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 8, _r0);
                    _mm_store_ps(p0 + 16 + 8, _r1);
                    _mm_store_ps(p0 + 16 * 2 + 8, _r2);
                    _mm_store_ps(p0 + 16 * 3 + 8, _r3);
                    pp += 16;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 12, _r0);
                _mm_store_ps(p0 + 16 + 12, _r1);
                _mm_store_ps(p0 + 16 * 2 + 12, _r2);
                _mm_store_ps(p0 + 16 * 3 + 12, _r3);
                pp += 16;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                __m128 _r8 = _mm_load_ps(pp + 4 * 8);
                __m128 _r9 = _mm_load_ps(pp + 4 * 9);
                __m128 _ra = _mm_load_ps(pp + 4 * 10);
                __m128 _rb = _mm_load_ps(pp + 4 * 11);
                __m128 _rc = _mm_load_ps(pp + 4 * 12);
                __m128 _rd = _mm_load_ps(pp + 4 * 13);
                __m128 _re = _mm_load_ps(pp + 4 * 14);
                __m128 _rf = _mm_load_ps(pp + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 4, _r4);
                _mm_store_ps(p0 + 4 * 2, _r8);
                _mm_store_ps(p0 + 4 * 3, _rc);
                _mm_store_ps(p0 + 4 * 4, _r1);
                _mm_store_ps(p0 + 4 * 5, _r5);
                _mm_store_ps(p0 + 4 * 6, _r9);
                _mm_store_ps(p0 + 4 * 7, _rd);
                _mm_store_ps(p0 + 4 * 8, _r2);
                _mm_store_ps(p0 + 4 * 9, _r6);
                _mm_store_ps(p0 + 4 * 10, _ra);
                _mm_store_ps(p0 + 4 * 11, _re);
                _mm_store_ps(p0 + 4 * 12, _r3);
                _mm_store_ps(p0 + 4 * 13, _r7);
                _mm_store_ps(p0 + 4 * 14, _rb);
                _mm_store_ps(p0 + 4 * 15, _rf);
                pp += 64;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                __m128 _r8 = _mm_load_ps(pp + 4 * 8);
                __m128 _r9 = _mm_load_ps(pp + 4 * 9);
                __m128 _ra = _mm_load_ps(pp + 4 * 10);
                __m128 _rb = _mm_load_ps(pp + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 4, _r4);
                _mm_store_ps(p0 + 8, _r8);
                _mm_store_ps(p0 + 16, _r1);
                _mm_store_ps(p0 + 16 + 4, _r5);
                _mm_store_ps(p0 + 16 + 8, _r9);
                _mm_store_ps(p0 + 16 * 2, _r2);
                _mm_store_ps(p0 + 16 * 2 + 4, _r6);
                _mm_store_ps(p0 + 16 * 2 + 8, _ra);
                _mm_store_ps(p0 + 16 * 3, _r3);
                _mm_store_ps(p0 + 16 * 3 + 4, _r7);
                _mm_store_ps(p0 + 16 * 3 + 8, _rb);
                pp += 48;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 4, _r4);
                _mm_store_ps(p0 + 16, _r1);
                _mm_store_ps(p0 + 16 + 4, _r5);
                _mm_store_ps(p0 + 16 * 2, _r2);
                _mm_store_ps(p0 + 16 * 2 + 4, _r6);
                _mm_store_ps(p0 + 16 * 3, _r3);
                _mm_store_ps(p0 + 16 * 3 + 4, _r7);
                pp += 32;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 16, _r1);
                _mm_store_ps(p0 + 16 * 2, _r2);
                _mm_store_ps(p0 + 16 * 3, _r3);
                pp += 16;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 4, _r0);
                _mm_store_ps(p0 + 8 + 4, _r1);
                _mm_store_ps(p0 + 8 * 2 + 4, _r2);
                _mm_store_ps(p0 + 8 * 3 + 4, _r3);
                pp += 16;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_storeu_ps(p0, _r0);
                _mm_storeu_ps(p0 + 4, _r4);
                _mm_storeu_ps(p0 + 4 * 2, _r1);
                _mm_storeu_ps(p0 + 4 * 3, _r5);
                _mm_storeu_ps(p0 + 4 * 4, _r2);
                _mm_storeu_ps(p0 + 4 * 5, _r6);
                _mm_storeu_ps(p0 + 4 * 6, _r3);
                _mm_storeu_ps(p0 + 4 * 7, _r7);
                pp += 32;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 8, _r1);
                _mm_store_ps(p0 + 8 * 2, _r2);
                _mm_store_ps(p0 + 8 * 3, _r3);
                pp += 16;
                p0 += out_hstep * 8;
            }
        }
#endif // __AVX__
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_storeu_ps(p0, _r0);
                _mm_storeu_ps(p0 + 4, _r1);
                _mm_storeu_ps(p0 + 4 * 2, _r2);
                _mm_storeu_ps(p0 + 4 * 3, _r3);
                pp += 16;
                p0 += out_hstep * 4;
            }
        }
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                __m128 _r0 = _mm_load_ps(pp);
                _mm_storeu_ps(p0, _r0);
                pp += 4;
                p0 += out_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    p0[0 + 4] = pp[0];
                    p0[1 + 4] = pp[2];
                    p0[2 + 4] = pp[4];
                    p0[3 + 4] = pp[6];
                    p0[4 + 4] = pp[8];
                    p0[5 + 4] = pp[10];
                    p0[6 + 4] = pp[12];
                    p0[7 + 4] = pp[14];
                    p0[8 + 4] = pp[16];
                    p0[9 + 4] = pp[18];
                    p0[10 + 4] = pp[20];
                    p0[11 + 4] = pp[22];
                    p0[16 + 4] = pp[1];
                    p0[17 + 4] = pp[3];
                    p0[18 + 4] = pp[5];
                    p0[19 + 4] = pp[7];
                    p0[20 + 4] = pp[9];
                    p0[21 + 4] = pp[11];
                    p0[22 + 4] = pp[13];
                    p0[23 + 4] = pp[15];
                    p0[24 + 4] = pp[17];
                    p0[25 + 4] = pp[19];
                    p0[26 + 4] = pp[21];
                    p0[27 + 4] = pp[23];
                    pp += 24;
                    jj += 12;
                }
                else
                {
                    p0[0 + 4] = pp[0];
                    p0[1 + 4] = pp[2];
                    p0[2 + 4] = pp[4];
                    p0[3 + 4] = pp[6];
                    p0[16 + 4] = pp[1];
                    p0[17 + 4] = pp[3];
                    p0[18 + 4] = pp[5];
                    p0[19 + 4] = pp[7];
                    pp += 8;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                if (max_jj > 4)
                {
                    p0[0 + 8] = pp[0];
                    p0[1 + 8] = pp[2];
                    p0[2 + 8] = pp[4];
                    p0[3 + 8] = pp[6];
                    p0[4 + 8] = pp[8];
                    p0[5 + 8] = pp[10];
                    p0[6 + 8] = pp[12];
                    p0[7 + 8] = pp[14];
                    p0[16 + 8] = pp[1];
                    p0[17 + 8] = pp[3];
                    p0[18 + 8] = pp[5];
                    p0[19 + 8] = pp[7];
                    p0[20 + 8] = pp[9];
                    p0[21 + 8] = pp[11];
                    p0[22 + 8] = pp[13];
                    p0[23 + 8] = pp[15];
                    pp += 16;
                    jj += 8;
                }
                else
                {
                    p0[0 + 8] = pp[0];
                    p0[1 + 8] = pp[2];
                    p0[2 + 8] = pp[4];
                    p0[3 + 8] = pp[6];
                    p0[16 + 8] = pp[1];
                    p0[17 + 8] = pp[3];
                    p0[18 + 8] = pp[5];
                    p0[19 + 8] = pp[7];
                    pp += 8;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                p0[0 + 12] = pp[0];
                p0[1 + 12] = pp[2];
                p0[2 + 12] = pp[4];
                p0[3 + 12] = pp[6];
                p0[16 + 12] = pp[1];
                p0[17 + 12] = pp[3];
                p0[18 + 12] = pp[5];
                p0[19 + 12] = pp[7];
                pp += 8;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[8] = pp[16];
                p0[9] = pp[18];
                p0[10] = pp[20];
                p0[11] = pp[22];
                p0[12] = pp[24];
                p0[13] = pp[26];
                p0[14] = pp[28];
                p0[15] = pp[30];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                p0[20] = pp[9];
                p0[21] = pp[11];
                p0[22] = pp[13];
                p0[23] = pp[15];
                p0[24] = pp[17];
                p0[25] = pp[19];
                p0[26] = pp[21];
                p0[27] = pp[23];
                p0[28] = pp[25];
                p0[29] = pp[27];
                p0[30] = pp[29];
                p0[31] = pp[31];
                pp += 32;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[8] = pp[16];
                p0[9] = pp[18];
                p0[10] = pp[20];
                p0[11] = pp[22];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                p0[20] = pp[9];
                p0[21] = pp[11];
                p0[22] = pp[13];
                p0[23] = pp[15];
                p0[24] = pp[17];
                p0[25] = pp[19];
                p0[26] = pp[21];
                p0[27] = pp[23];
                pp += 24;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                p0[20] = pp[9];
                p0[21] = pp[11];
                p0[22] = pp[13];
                p0[23] = pp[15];
                pp += 16;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                pp += 8;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                p0[0 + 4] = pp[0];
                p0[1 + 4] = pp[2];
                p0[2 + 4] = pp[4];
                p0[3 + 4] = pp[6];
                p0[8 + 4] = pp[1];
                p0[9 + 4] = pp[3];
                p0[10 + 4] = pp[5];
                p0[11 + 4] = pp[7];
                pp += 8;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[8] = pp[1];
                p0[9] = pp[3];
                p0[10] = pp[5];
                p0[11] = pp[7];
                p0[12] = pp[9];
                p0[13] = pp[11];
                p0[14] = pp[13];
                p0[15] = pp[15];
                pp += 16;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[8] = pp[1];
                p0[9] = pp[3];
                p0[10] = pp[5];
                p0[11] = pp[7];
                pp += 8;
                p0 += out_hstep * 8;
            }
        }
#endif // __AVX__
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[1];
                p0[5] = pp[3];
                p0[6] = pp[5];
                p0[7] = pp[7];
                pp += 8;
                p0 += out_hstep * 4;
            }
        }
#endif // __SSE2__
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                p0[0] = pp[0];
                p0[1] = pp[1];
                pp += 2;
                p0 += out_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m256 _r0 = _mm256_loadu_ps(pp);
                    __m128 _r1 = _mm_loadu_ps(pp + 8);
                    _mm256_storeu_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 4 + 8, _r1);
                    pp += 12;
                    jj += 12;
                }
                else
                {
                    __m128 _r0 = _mm_loadu_ps(pp);
                    _mm_storeu_ps(p0 + 4, _r0);
                    pp += 4;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                if (max_jj > 4)
                {
                    __m256 _r0 = _mm256_loadu_ps(pp);
                    _mm256_store_ps(p0 + 8, _r0);
                    pp += 8;
                    jj += 8;
                }
                else
                {
                    __m128 _r0 = _mm_loadu_ps(pp);
                    _mm_store_ps(p0 + 8, _r0);
                    pp += 4;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m128 _r0 = _mm_loadu_ps(pp);
                _mm_store_ps(p0 + 12, _r0);
                pp += 4;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(pp);
                _mm512_store_ps(p0, _r0);
                pp += 16;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m256 _r0 = _mm256_loadu_ps(pp);
                __m128 _r1 = _mm_loadu_ps(pp + 8);
                _mm256_store_ps(p0, _r0);
                _mm_store_ps(p0 + 8, _r1);
                pp += 12;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(pp);
                _mm256_store_ps(p0, _r0);
                pp += 8;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_loadu_ps(pp);
                _mm_store_ps(p0, _r0);
                pp += 4;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                p0[0 + 4] = pp[0];
                p0[1 + 4] = pp[1];
                p0[2 + 4] = pp[2];
                p0[3 + 4] = pp[3];
                pp += 4;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(pp);
                _mm256_store_ps(p0, _r0);
                pp += 8;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[1];
                p0[2] = pp[2];
                p0[3] = pp[3];
                pp += 4;
                p0 += out_hstep * 8;
            }
        }
#endif // __AVX__
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_loadu_ps(pp);
                _mm_store_ps(p0, _r0);
                pp += 4;
                p0 += out_hstep * 4;
            }
        }
#endif // __SSE2__
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                p0[0] = pp[0];
                pp += 1;
                p0 += out_hstep;
            }
        }
    }
}